

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [28];
  undefined1 auVar23 [28];
  undefined1 auVar24 [28];
  undefined1 auVar25 [28];
  int iVar26;
  int iVar27;
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  int iVar111;
  float fVar112;
  undefined4 uVar113;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  vint4 bi_1;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  vint4 bi;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar139;
  float fVar140;
  vfloat4 a0;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar141;
  vint4 ai_2;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 ai;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  float fVar187;
  float fVar195;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  vfloat4 a0_3;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar225;
  float fVar234;
  float fVar235;
  vfloat4 b0_2;
  undefined1 auVar226 [16];
  float fVar236;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  vfloat4 a0_4;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_378 [16];
  ulong local_368;
  Primitive *local_360;
  RTCFilterFunctionNArguments local_358;
  undefined1 local_328 [16];
  uint auStack_318 [4];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar32;
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  uint uVar110;
  float fVar142;
  float fVar151;
  float fVar152;
  float fVar168;
  float fVar169;
  float fVar186;
  undefined1 auVar263 [32];
  
  PVar5 = prim[1];
  uVar30 = (ulong)(byte)PVar5;
  lVar33 = uVar30 * 0x25;
  fVar112 = *(float *)(prim + lVar33 + 0x12);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar44 = vsubps_avx(auVar44,*(undefined1 (*) [16])(prim + lVar33 + 6));
  auVar67._0_4_ = fVar112 * auVar44._0_4_;
  auVar67._4_4_ = fVar112 * auVar44._4_4_;
  auVar67._8_4_ = fVar112 * auVar44._8_4_;
  auVar67._12_4_ = fVar112 * auVar44._12_4_;
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 4 + 6)));
  auVar48._0_4_ = fVar112 * auVar45._0_4_;
  auVar48._4_4_ = fVar112 * auVar45._4_4_;
  auVar48._8_4_ = fVar112 * auVar45._8_4_;
  auVar48._12_4_ = fVar112 * auVar45._12_4_;
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 5 + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 6 + 6)));
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 0xf + 6)));
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar30 + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 0x1a + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 0x1b + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar30 * 0x1c + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar153._4_4_ = auVar48._0_4_;
  auVar153._0_4_ = auVar48._0_4_;
  auVar153._8_4_ = auVar48._0_4_;
  auVar153._12_4_ = auVar48._0_4_;
  auVar62 = vshufps_avx(auVar48,auVar48,0x55);
  auVar63 = vshufps_avx(auVar48,auVar48,0xaa);
  fVar112 = auVar63._0_4_;
  auVar56._0_4_ = fVar112 * auVar46._0_4_;
  fVar121 = auVar63._4_4_;
  auVar56._4_4_ = fVar121 * auVar46._4_4_;
  fVar239 = auVar63._8_4_;
  auVar56._8_4_ = fVar239 * auVar46._8_4_;
  fVar225 = auVar63._12_4_;
  auVar56._12_4_ = fVar225 * auVar46._12_4_;
  auVar68._0_4_ = auVar57._0_4_ * fVar112;
  auVar68._4_4_ = auVar57._4_4_ * fVar121;
  auVar68._8_4_ = auVar57._8_4_ * fVar239;
  auVar68._12_4_ = auVar57._12_4_ * fVar225;
  auVar49._0_4_ = auVar61._0_4_ * fVar112;
  auVar49._4_4_ = auVar61._4_4_ * fVar121;
  auVar49._8_4_ = auVar61._8_4_ * fVar239;
  auVar49._12_4_ = auVar61._12_4_ * fVar225;
  auVar63 = vfmadd231ps_fma(auVar56,auVar62,auVar45);
  auVar14 = vfmadd231ps_fma(auVar68,auVar62,auVar60);
  auVar62 = vfmadd231ps_fma(auVar49,auVar59,auVar62);
  auVar15 = vfmadd231ps_fma(auVar63,auVar153,auVar44);
  auVar14 = vfmadd231ps_fma(auVar14,auVar153,auVar54);
  auVar64 = vfmadd231ps_fma(auVar62,auVar58,auVar153);
  auVar257._4_4_ = auVar67._0_4_;
  auVar257._0_4_ = auVar67._0_4_;
  auVar257._8_4_ = auVar67._0_4_;
  auVar257._12_4_ = auVar67._0_4_;
  auVar62 = vshufps_avx(auVar67,auVar67,0x55);
  auVar63 = vshufps_avx(auVar67,auVar67,0xaa);
  fVar112 = auVar63._0_4_;
  auVar154._0_4_ = fVar112 * auVar46._0_4_;
  fVar121 = auVar63._4_4_;
  auVar154._4_4_ = fVar121 * auVar46._4_4_;
  fVar239 = auVar63._8_4_;
  auVar154._8_4_ = fVar239 * auVar46._8_4_;
  fVar225 = auVar63._12_4_;
  auVar154._12_4_ = fVar225 * auVar46._12_4_;
  auVar70._0_4_ = auVar57._0_4_ * fVar112;
  auVar70._4_4_ = auVar57._4_4_ * fVar121;
  auVar70._8_4_ = auVar57._8_4_ * fVar239;
  auVar70._12_4_ = auVar57._12_4_ * fVar225;
  auVar69._0_4_ = auVar61._0_4_ * fVar112;
  auVar69._4_4_ = auVar61._4_4_ * fVar121;
  auVar69._8_4_ = auVar61._8_4_ * fVar239;
  auVar69._12_4_ = auVar61._12_4_ * fVar225;
  auVar45 = vfmadd231ps_fma(auVar154,auVar62,auVar45);
  auVar46 = vfmadd231ps_fma(auVar70,auVar62,auVar60);
  auVar60 = vfmadd231ps_fma(auVar69,auVar62,auVar59);
  auVar47 = vfmadd231ps_fma(auVar45,auVar257,auVar44);
  auVar48 = vfmadd231ps_fma(auVar46,auVar257,auVar54);
  auVar68 = in_YmmResult._16_16_;
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar275 = ZEXT1664(auVar44);
  auVar49 = vfmadd231ps_fma(auVar60,auVar257,auVar58);
  auVar45 = vandps_avx512vl(auVar15,auVar44);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  uVar42 = vcmpps_avx512vl(auVar45,auVar188,1);
  bVar40 = (bool)((byte)uVar42 & 1);
  auVar50._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar15._0_4_;
  bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar15._4_4_;
  bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar15._8_4_;
  bVar40 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar50._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar15._12_4_;
  auVar45 = vandps_avx512vl(auVar14,auVar44);
  uVar42 = vcmpps_avx512vl(auVar45,auVar188,1);
  bVar40 = (bool)((byte)uVar42 & 1);
  auVar51._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar14._0_4_;
  bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar14._4_4_;
  bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar14._8_4_;
  bVar40 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar51._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar14._12_4_;
  auVar44 = vandps_avx512vl(auVar64,auVar44);
  uVar42 = vcmpps_avx512vl(auVar44,auVar188,1);
  bVar40 = (bool)((byte)uVar42 & 1);
  auVar52._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar64._0_4_;
  bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar52._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar64._4_4_;
  bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar52._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar64._8_4_;
  bVar40 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar52._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar64._12_4_;
  auVar44 = vrcp14ps_avx512vl(auVar50);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar276 = ZEXT1664(auVar45);
  auVar46 = vfnmadd213ps_avx512vl(auVar50,auVar44,auVar45);
  auVar15 = vfmadd132ps_fma(auVar46,auVar44,auVar44);
  auVar44 = vrcp14ps_avx512vl(auVar51);
  auVar46 = vfnmadd213ps_avx512vl(auVar51,auVar44,auVar45);
  auVar64 = vfmadd132ps_fma(auVar46,auVar44,auVar44);
  auVar44 = vrcp14ps_avx512vl(auVar52);
  auVar45 = vfnmadd213ps_avx512vl(auVar52,auVar44,auVar45);
  auVar65 = vfmadd132ps_fma(auVar45,auVar44,auVar44);
  fVar112 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar33 + 0x16)) *
            *(float *)(prim + lVar33 + 0x1a);
  auVar170._4_4_ = fVar112;
  auVar170._0_4_ = fVar112;
  auVar170._8_4_ = fVar112;
  auVar170._12_4_ = fVar112;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar30 * 7 + 6);
  auVar44 = vpmovsxwd_avx(auVar44);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar30 * 0xb + 6);
  auVar45 = vpmovsxwd_avx(auVar45);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar54 = vsubps_avx(auVar45,auVar44);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar30 * 9 + 6);
  auVar45 = vpmovsxwd_avx(auVar46);
  auVar46 = vfmadd213ps_fma(auVar54,auVar170,auVar44);
  auVar44 = vcvtdq2ps_avx(auVar45);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar30 * 0xd + 6);
  auVar45 = vpmovsxwd_avx(auVar54);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar54 = vfmadd213ps_fma(auVar45,auVar170,auVar44);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar30 * 0x12 + 6);
  auVar44 = vpmovsxwd_avx(auVar60);
  auVar44 = vcvtdq2ps_avx(auVar44);
  uVar42 = (ulong)(uint)((int)(uVar30 * 5) << 2);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar30 * 2 + uVar42 + 6);
  auVar45 = vpmovsxwd_avx(auVar57);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar60 = vfmadd213ps_fma(auVar45,auVar170,auVar44);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar42 + 6);
  auVar44 = vpmovsxwd_avx(auVar58);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar30 * 0x18 + 6);
  auVar45 = vpmovsxwd_avx(auVar59);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar57 = vfmadd213ps_fma(auVar45,auVar170,auVar44);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar30 * 0x1d + 6);
  auVar44 = vpmovsxwd_avx(auVar61);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar30 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar45 = vpmovsxwd_avx(auVar62);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar58 = vfmadd213ps_fma(auVar45,auVar170,auVar44);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar30) + 6);
  auVar44 = vpmovsxwd_avx(auVar63);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar30 * 0x23 + 6);
  auVar45 = vpmovsxwd_avx(auVar14);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar44);
  auVar45 = vfmadd213ps_fma(auVar45,auVar170,auVar44);
  auVar44 = vsubps_avx(auVar46,auVar47);
  auVar171._0_4_ = auVar15._0_4_ * auVar44._0_4_;
  auVar171._4_4_ = auVar15._4_4_ * auVar44._4_4_;
  auVar171._8_4_ = auVar15._8_4_ * auVar44._8_4_;
  auVar171._12_4_ = auVar15._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar54,auVar47);
  auVar66._0_4_ = auVar15._0_4_ * auVar44._0_4_;
  auVar66._4_4_ = auVar15._4_4_ * auVar44._4_4_;
  auVar66._8_4_ = auVar15._8_4_ * auVar44._8_4_;
  auVar66._12_4_ = auVar15._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar60,auVar48);
  auVar155._0_4_ = auVar64._0_4_ * auVar44._0_4_;
  auVar155._4_4_ = auVar64._4_4_ * auVar44._4_4_;
  auVar155._8_4_ = auVar64._8_4_ * auVar44._8_4_;
  auVar155._12_4_ = auVar64._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar57,auVar48);
  auVar55._0_4_ = auVar64._0_4_ * auVar44._0_4_;
  auVar55._4_4_ = auVar64._4_4_ * auVar44._4_4_;
  auVar55._8_4_ = auVar64._8_4_ * auVar44._8_4_;
  auVar55._12_4_ = auVar64._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar58,auVar49);
  auVar71._0_4_ = auVar65._0_4_ * auVar44._0_4_;
  auVar71._4_4_ = auVar65._4_4_ * auVar44._4_4_;
  auVar71._8_4_ = auVar65._8_4_ * auVar44._8_4_;
  auVar71._12_4_ = auVar65._12_4_ * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar45,auVar49);
  auVar53._0_4_ = auVar65._0_4_ * auVar44._0_4_;
  auVar53._4_4_ = auVar65._4_4_ * auVar44._4_4_;
  auVar53._8_4_ = auVar65._8_4_ * auVar44._8_4_;
  auVar53._12_4_ = auVar65._12_4_ * auVar44._12_4_;
  auVar44 = vpminsd_avx(auVar171,auVar66);
  auVar45 = vpminsd_avx(auVar155,auVar55);
  auVar44 = vmaxps_avx(auVar44,auVar45);
  auVar45 = vpminsd_avx(auVar71,auVar53);
  uVar113 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar15._4_4_ = uVar113;
  auVar15._0_4_ = uVar113;
  auVar15._8_4_ = uVar113;
  auVar15._12_4_ = uVar113;
  auVar45 = vmaxps_avx512vl(auVar45,auVar15);
  auVar44 = vmaxps_avx(auVar44,auVar45);
  auVar64._8_4_ = 0x3f7ffffa;
  auVar64._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar64._12_4_ = 0x3f7ffffa;
  local_2d8 = vmulps_avx512vl(auVar44,auVar64);
  auVar44 = vpmaxsd_avx(auVar171,auVar66);
  auVar45 = vpmaxsd_avx(auVar155,auVar55);
  auVar44 = vminps_avx(auVar44,auVar45);
  auVar45 = vpmaxsd_avx(auVar71,auVar53);
  uVar113 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar65._4_4_ = uVar113;
  auVar65._0_4_ = uVar113;
  auVar65._8_4_ = uVar113;
  auVar65._12_4_ = uVar113;
  auVar45 = vminps_avx512vl(auVar45,auVar65);
  auVar44 = vminps_avx(auVar44,auVar45);
  auVar47._8_4_ = 0x3f800003;
  auVar47._0_8_ = 0x3f8000033f800003;
  auVar47._12_4_ = 0x3f800003;
  auVar44 = vmulps_avx512vl(auVar44,auVar47);
  auVar45 = vpbroadcastd_avx512vl();
  uVar12 = vcmpps_avx512vl(local_2d8,auVar44,2);
  uVar42 = vpcmpgtd_avx512vl(auVar45,_DAT_01f7fcf0);
  uVar42 = ((byte)uVar12 & 0xf) & uVar42;
  if ((char)uVar42 == '\0') {
    return;
  }
  local_308 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar44 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar271 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar278 = ZEXT1664(auVar44);
  local_360 = prim;
LAB_01bc3ffd:
  lVar33 = 0;
  for (uVar30 = uVar42; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    lVar33 = lVar33 + 1;
  }
  uVar30 = (ulong)*(uint *)(local_360 + 2);
  pGVar6 = (context->scene->geometries).items[uVar30].ptr;
  fVar112 = (pGVar6->time_range).lower;
  fVar239 = pGVar6->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar112) / ((pGVar6->time_range).upper - fVar112));
  auVar44 = vroundss_avx(ZEXT416((uint)fVar239),ZEXT416((uint)fVar239),9);
  uVar37 = *(uint *)(local_360 + lVar33 * 4 + 6);
  auVar45 = vaddss_avx512f(ZEXT416((uint)pGVar6->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar44 = vminss_avx(auVar44,auVar45);
  auVar47 = vmaxss_avx512f(auVar271._0_16_,auVar44);
  uVar31 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)uVar37 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar35 = (long)(int)auVar47._0_4_ * 0x38;
  lVar8 = *(long *)(_Var7 + lVar35);
  lVar9 = *(long *)(_Var7 + 0x10 + lVar35);
  auVar44 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar31);
  lVar33 = uVar31 + 1;
  auVar45 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar33);
  lVar1 = uVar31 + 2;
  auVar46 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar1);
  lVar2 = uVar31 + 3;
  auVar54 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar2);
  lVar8 = *(long *)&pGVar6[4].fnumTimeSegments;
  lVar9 = *(long *)(lVar8 + lVar35);
  lVar10 = *(long *)(lVar8 + 0x10 + lVar35);
  auVar60 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar31);
  auVar57 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar33);
  auVar58 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  auVar59 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)(_Var7 + 0x38 + lVar35);
  lVar10 = *(long *)(_Var7 + 0x48 + lVar35);
  auVar61 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar31);
  auVar62 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar33);
  auVar63 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  auVar14 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)(lVar8 + 0x38 + lVar35);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar35);
  auVar15 = *(undefined1 (*) [16])(lVar9 + uVar31 * lVar8);
  auVar64 = *(undefined1 (*) [16])(lVar9 + lVar33 * lVar8);
  auVar65 = *(undefined1 (*) [16])(lVar9 + lVar1 * lVar8);
  fVar239 = fVar239 - auVar47._0_4_;
  auVar91._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar47 = vmulps_avx512vl(auVar54,auVar91._0_16_);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar49 = vfmadd213ps_avx512vl(auVar48,auVar46,auVar47);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar45,auVar50);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar44,auVar48);
  auVar66 = auVar278._0_16_;
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar66);
  auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar45,auVar91._0_16_);
  auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar44,auVar66);
  auVar51 = vmulps_avx512vl(auVar59,auVar91._0_16_);
  auVar52 = vfmadd213ps_avx512vl(auVar48,auVar58,auVar51);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar57,auVar50);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar60,auVar48);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar58,auVar66);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar57,auVar91._0_16_);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar60,auVar66);
  auVar53 = vmulps_avx512vl(auVar54,auVar48);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar46,auVar50);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar45,auVar48);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar44,auVar91._0_16_);
  auVar54 = vmulps_avx512vl(auVar54,auVar66);
  auVar46 = vfmadd231ps_avx512vl(auVar54,auVar91._0_16_,auVar46);
  auVar45 = vfnmadd231ps_avx512vl(auVar46,auVar66,auVar45);
  auVar55 = vfnmadd231ps_avx512vl(auVar45,auVar91._0_16_,auVar44);
  auVar44 = vmulps_avx512vl(auVar59,auVar48);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar58,auVar50);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar57,auVar48);
  auVar56 = vfmadd231ps_avx512vl(auVar44,auVar60,auVar91._0_16_);
  auVar44 = vmulps_avx512vl(auVar59,auVar66);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar91._0_16_,auVar58);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar66,auVar57);
  auVar57 = vfnmadd231ps_avx512vl(auVar44,auVar91._0_16_,auVar60);
  auVar45 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  auVar44 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar44 = vmulps_avx512vl(auVar47,auVar44);
  auVar44 = vfmsub231ps_avx512vl(auVar44,auVar45,auVar52);
  auVar46 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar44 = vmulps_avx512vl(auVar47,auVar44);
  auVar44 = vfmsub231ps_fma(auVar44,auVar45,auVar51);
  auVar54 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar45 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar172._0_4_ = auVar55._0_4_ * auVar45._0_4_;
  auVar172._4_4_ = auVar55._4_4_ * auVar45._4_4_;
  auVar172._8_4_ = auVar55._8_4_ * auVar45._8_4_;
  auVar172._12_4_ = auVar55._12_4_ * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar172,auVar44,auVar56);
  auVar60 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar173._0_4_ = auVar55._0_4_ * auVar45._0_4_;
  auVar173._4_4_ = auVar55._4_4_ * auVar45._4_4_;
  auVar173._8_4_ = auVar55._8_4_ * auVar45._8_4_;
  auVar173._12_4_ = auVar55._12_4_ * auVar45._12_4_;
  auVar44 = vfmsub231ps_fma(auVar173,auVar44,auVar57);
  auVar57 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vdpps_avx(auVar46,auVar46,0x7f);
  auVar91._16_16_ = auVar68;
  auVar88._4_28_ = auVar91._4_28_;
  auVar88._0_4_ = auVar44._0_4_;
  auVar45 = vrsqrt14ss_avx512f(auVar91._0_16_,auVar88._0_16_);
  auVar58 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar59 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  auVar59 = vmulss_avx512f(auVar59,auVar45);
  auVar45 = vmulss_avx512f(auVar59,ZEXT416((uint)(auVar45._0_4_ * auVar45._0_4_)));
  fVar112 = auVar58._0_4_ + auVar45._0_4_;
  auVar196._4_4_ = fVar112;
  auVar196._0_4_ = fVar112;
  auVar196._8_4_ = fVar112;
  auVar196._12_4_ = fVar112;
  auVar45 = vdpps_avx(auVar46,auVar54,0x7f);
  auVar58 = vmulps_avx512vl(auVar46,auVar196);
  auVar59 = vbroadcastss_avx512vl(auVar44);
  auVar54 = vmulps_avx512vl(auVar59,auVar54);
  fVar121 = auVar45._0_4_;
  auVar156._0_4_ = fVar121 * auVar46._0_4_;
  auVar156._4_4_ = fVar121 * auVar46._4_4_;
  auVar156._8_4_ = fVar121 * auVar46._8_4_;
  auVar156._12_4_ = fVar121 * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar54,auVar156);
  auVar45 = vrcp14ss_avx512f(auVar91._0_16_,auVar88._0_16_);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar45,ZEXT416(0x40000000));
  fVar225 = auVar45._0_4_ * auVar44._0_4_;
  auVar44 = vdpps_avx(auVar60,auVar60,0x7f);
  auVar73._16_16_ = auVar68;
  auVar73._0_16_ = auVar91._0_16_;
  auVar90._4_28_ = auVar73._4_28_;
  auVar90._0_4_ = auVar44._0_4_;
  auVar45 = vrsqrt14ss_avx512f(auVar91._0_16_,auVar90._0_16_);
  auVar54 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar59 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  fVar121 = auVar45._0_4_;
  fVar121 = auVar54._0_4_ + auVar59._0_4_ * fVar121 * fVar121 * fVar121;
  auVar197._0_4_ = auVar60._0_4_ * fVar121;
  auVar197._4_4_ = auVar60._4_4_ * fVar121;
  auVar197._8_4_ = auVar60._8_4_ * fVar121;
  auVar197._12_4_ = auVar60._12_4_ * fVar121;
  auVar45 = vdpps_avx(auVar60,auVar57,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar44);
  auVar54 = vmulps_avx512vl(auVar54,auVar57);
  fVar234 = auVar45._0_4_;
  auVar122._0_4_ = fVar234 * auVar60._0_4_;
  auVar122._4_4_ = fVar234 * auVar60._4_4_;
  auVar122._8_4_ = fVar234 * auVar60._8_4_;
  auVar122._12_4_ = fVar234 * auVar60._12_4_;
  auVar45 = vsubps_avx(auVar54,auVar122);
  auVar54 = vrcp14ss_avx512f(auVar91._0_16_,auVar90._0_16_);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar54,ZEXT416(0x40000000));
  fVar234 = auVar54._0_4_ * auVar44._0_4_;
  auVar44 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar54 = vmulps_avx512vl(auVar44,auVar58);
  auVar51 = vsubps_avx512vl(auVar49,auVar54);
  auVar60 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar60 = vmulps_avx512vl(auVar60,auVar58);
  auVar143._0_4_ = auVar60._0_4_ + auVar44._0_4_ * fVar112 * fVar225 * auVar46._0_4_;
  auVar143._4_4_ = auVar60._4_4_ + auVar44._4_4_ * fVar112 * fVar225 * auVar46._4_4_;
  auVar143._8_4_ = auVar60._8_4_ + auVar44._8_4_ * fVar112 * fVar225 * auVar46._8_4_;
  auVar143._12_4_ = auVar60._12_4_ + auVar44._12_4_ * fVar112 * fVar225 * auVar46._12_4_;
  auVar46 = vsubps_avx512vl(auVar47,auVar143);
  auVar49 = vaddps_avx512vl(auVar49,auVar54);
  auVar54 = vaddps_avx512vl(auVar47,auVar143);
  auVar44 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar60 = vmulps_avx512vl(auVar44,auVar197);
  auVar47 = vsubps_avx512vl(auVar53,auVar60);
  auVar57 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar57 = vmulps_avx512vl(auVar57,auVar197);
  auVar198._0_4_ = auVar57._0_4_ + auVar44._0_4_ * fVar121 * auVar45._0_4_ * fVar234;
  auVar198._4_4_ = auVar57._4_4_ + auVar44._4_4_ * fVar121 * auVar45._4_4_ * fVar234;
  auVar198._8_4_ = auVar57._8_4_ + auVar44._8_4_ * fVar121 * auVar45._8_4_ * fVar234;
  auVar198._12_4_ = auVar57._12_4_ + auVar44._12_4_ * fVar121 * auVar45._12_4_ * fVar234;
  auVar44 = vsubps_avx(auVar55,auVar198);
  auVar52 = vaddps_avx512vl(auVar53,auVar60);
  auVar45 = vaddps_avx512vl(auVar55,auVar198);
  auVar114._8_4_ = 0x3eaaaaab;
  auVar114._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar114._12_4_ = 0x3eaaaaab;
  auVar189._0_4_ = auVar51._0_4_ + auVar46._0_4_ * 0.33333334;
  auVar189._4_4_ = auVar51._4_4_ + auVar46._4_4_ * 0.33333334;
  auVar189._8_4_ = auVar51._8_4_ + auVar46._8_4_ * 0.33333334;
  auVar189._12_4_ = auVar51._12_4_ + auVar46._12_4_ * 0.33333334;
  auVar174._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar174._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar174._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar174._12_4_ = auVar44._12_4_ * 0.33333334;
  auVar58 = vsubps_avx(auVar47,auVar174);
  local_438._4_4_ = auVar49._4_4_ + auVar54._4_4_ * 0.33333334;
  local_438._0_4_ = auVar49._0_4_ + auVar54._0_4_ * 0.33333334;
  fStack_430 = auVar49._8_4_ + auVar54._8_4_ * 0.33333334;
  fStack_42c = auVar49._12_4_ + auVar54._12_4_ * 0.33333334;
  auVar44 = vmulps_avx512vl(auVar45,auVar114);
  auVar59 = vsubps_avx(auVar52,auVar44);
  auVar44 = *(undefined1 (*) [16])(lVar9 + lVar8 * lVar2);
  auVar45 = vmulps_avx512vl(auVar14,auVar91._0_16_);
  auVar46 = vfmadd213ps_avx512vl(auVar48,auVar63,auVar45);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar62,auVar50);
  auVar53 = vfmadd231ps_avx512vl(auVar46,auVar61,auVar48);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar63,auVar66);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar62,auVar91._0_16_);
  auVar55 = vfnmadd231ps_avx512vl(auVar45,auVar61,auVar66);
  auVar45 = vmulps_avx512vl(auVar44,auVar91._0_16_);
  auVar46 = vfmadd213ps_avx512vl(auVar48,auVar65,auVar45);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar64,auVar50);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar15,auVar48);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar65,auVar66);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar64,auVar91._0_16_);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar15,auVar66);
  auVar54 = vmulps_avx512vl(auVar14,auVar48);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar63,auVar50);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar62,auVar48);
  auVar56 = vfmadd231ps_avx512vl(auVar54,auVar61,auVar91._0_16_);
  auVar54 = vmulps_avx512vl(auVar14,auVar66);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar91._0_16_,auVar63);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar66,auVar62);
  auVar61 = vfnmadd231ps_avx512vl(auVar54,auVar91._0_16_,auVar61);
  auVar54 = vmulps_avx512vl(auVar44,auVar48);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar65,auVar50);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar64,auVar48);
  auVar60 = vfmadd231ps_avx512vl(auVar54,auVar15,auVar91._0_16_);
  auVar44 = vmulps_avx512vl(auVar44,auVar66);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar91._0_16_,auVar65);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar66,auVar64);
  auVar57 = vfnmadd231ps_avx512vl(auVar44,auVar91._0_16_,auVar15);
  auVar44 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar54 = vshufps_avx512vl(auVar46,auVar46,0xc9);
  fVar234 = auVar55._0_4_;
  auVar240._0_4_ = fVar234 * auVar54._0_4_;
  fVar235 = auVar55._4_4_;
  auVar240._4_4_ = fVar235 * auVar54._4_4_;
  fVar142 = auVar55._8_4_;
  auVar240._8_4_ = fVar142 * auVar54._8_4_;
  fVar151 = auVar55._12_4_;
  auVar240._12_4_ = fVar151 * auVar54._12_4_;
  auVar46 = vfmsub231ps_avx512vl(auVar240,auVar44,auVar46);
  auVar46 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar54 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar249._0_4_ = fVar234 * auVar54._0_4_;
  auVar249._4_4_ = fVar235 * auVar54._4_4_;
  auVar249._8_4_ = fVar142 * auVar54._8_4_;
  auVar249._12_4_ = fVar151 * auVar54._12_4_;
  auVar44 = vfmsub231ps_avx512vl(auVar249,auVar44,auVar45);
  auVar54 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar62 = vshufps_avx512vl(auVar61,auVar61,0xc9);
  auVar44 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar44 = vmulps_avx512vl(auVar61,auVar44);
  auVar44 = vfmsub231ps_fma(auVar44,auVar62,auVar60);
  auVar60 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar45 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar44 = vdpps_avx(auVar46,auVar46,0x7f);
  auVar45 = vmulps_avx512vl(auVar61,auVar45);
  auVar45 = vfmsub231ps_fma(auVar45,auVar62,auVar57);
  auVar57 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar74._16_16_ = auVar68;
  auVar74._0_16_ = auVar91._0_16_;
  auVar75._4_28_ = auVar74._4_28_;
  auVar75._0_4_ = auVar44._0_4_;
  auVar45 = vrsqrt14ss_avx512f(auVar91._0_16_,auVar75._0_16_);
  auVar62 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  auVar63 = vmulss_avx512f(auVar63,auVar45);
  auVar45 = vmulss_avx512f(auVar63,ZEXT416((uint)(auVar45._0_4_ * auVar45._0_4_)));
  auVar45 = vaddss_avx512f(auVar62,auVar45);
  auVar264._0_4_ = auVar45._0_4_;
  auVar264._4_4_ = auVar264._0_4_;
  auVar264._8_4_ = auVar264._0_4_;
  auVar264._12_4_ = auVar264._0_4_;
  auVar62 = vmulps_avx512vl(auVar46,auVar264);
  auVar45 = vdpps_avx(auVar46,auVar54,0x7f);
  auVar63 = vbroadcastss_avx512vl(auVar44);
  auVar54 = vmulps_avx512vl(auVar63,auVar54);
  fVar112 = auVar45._0_4_;
  auVar175._0_4_ = auVar46._0_4_ * fVar112;
  auVar175._4_4_ = auVar46._4_4_ * fVar112;
  auVar175._8_4_ = auVar46._8_4_ * fVar112;
  auVar175._12_4_ = auVar46._12_4_ * fVar112;
  auVar46 = vsubps_avx(auVar54,auVar175);
  auVar45 = vrcp14ss_avx512f(auVar91._0_16_,auVar75._0_16_);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar45,ZEXT416(0x40000000));
  fVar121 = auVar45._0_4_ * auVar44._0_4_;
  auVar44 = vdpps_avx(auVar60,auVar60,0x7f);
  auVar76._16_16_ = auVar68;
  auVar76._0_16_ = auVar91._0_16_;
  auVar77._4_28_ = auVar76._4_28_;
  auVar77._0_4_ = auVar44._0_4_;
  auVar45 = vrsqrt14ss_avx512f(auVar91._0_16_,auVar77._0_16_);
  auVar54 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar63 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  auVar277 = ZEXT464(0x3f800000);
  fVar112 = auVar45._0_4_;
  fVar112 = auVar54._0_4_ + auVar63._0_4_ * fVar112 * fVar112 * fVar112;
  auVar258._0_4_ = auVar60._0_4_ * fVar112;
  auVar258._4_4_ = auVar60._4_4_ * fVar112;
  auVar258._8_4_ = auVar60._8_4_ * fVar112;
  auVar258._12_4_ = auVar60._12_4_ * fVar112;
  auVar45 = vdpps_avx(auVar60,auVar57,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar44);
  auVar54 = vmulps_avx512vl(auVar54,auVar57);
  fVar225 = auVar45._0_4_;
  auVar216._0_4_ = fVar225 * auVar60._0_4_;
  auVar216._4_4_ = fVar225 * auVar60._4_4_;
  auVar216._8_4_ = fVar225 * auVar60._8_4_;
  auVar216._12_4_ = fVar225 * auVar60._12_4_;
  auVar45 = vsubps_avx(auVar54,auVar216);
  auVar54 = vrcp14ss_avx512f(auVar91._0_16_,auVar77._0_16_);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar54,ZEXT416(0x40000000));
  fVar225 = auVar44._0_4_ * auVar54._0_4_;
  auVar54 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar60 = vmulps_avx512vl(auVar54,auVar62);
  auVar57 = vsubps_avx512vl(auVar53,auVar60);
  auVar44 = vshufps_avx(auVar55,auVar55,0xff);
  auVar44 = vmulps_avx512vl(auVar44,auVar62);
  auVar157._0_4_ = auVar44._0_4_ + auVar54._0_4_ * auVar264._0_4_ * fVar121 * auVar46._0_4_;
  auVar157._4_4_ = auVar44._4_4_ + auVar54._4_4_ * auVar264._0_4_ * fVar121 * auVar46._4_4_;
  auVar157._8_4_ = auVar44._8_4_ + auVar54._8_4_ * auVar264._0_4_ * fVar121 * auVar46._8_4_;
  auVar157._12_4_ = auVar44._12_4_ + auVar54._12_4_ * auVar264._0_4_ * fVar121 * auVar46._12_4_;
  auVar44 = vsubps_avx(auVar55,auVar157);
  auVar46 = vaddps_avx512vl(auVar53,auVar60);
  auVar54 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar250._0_4_ = auVar54._0_4_ * auVar258._0_4_;
  auVar250._4_4_ = auVar54._4_4_ * auVar258._4_4_;
  auVar250._8_4_ = auVar54._8_4_ * auVar258._8_4_;
  auVar250._12_4_ = auVar54._12_4_ * auVar258._12_4_;
  auVar60 = vsubps_avx512vl(auVar56,auVar250);
  auVar62 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar62 = vmulps_avx512vl(auVar62,auVar258);
  auVar176._0_4_ = auVar62._0_4_ + auVar54._0_4_ * fVar112 * auVar45._0_4_ * fVar225;
  auVar176._4_4_ = auVar62._4_4_ + auVar54._4_4_ * fVar112 * auVar45._4_4_ * fVar225;
  auVar176._8_4_ = auVar62._8_4_ + auVar54._8_4_ * fVar112 * auVar45._8_4_ * fVar225;
  auVar176._12_4_ = auVar62._12_4_ + auVar54._12_4_ * fVar112 * auVar45._12_4_ * fVar225;
  auVar45 = vsubps_avx512vl(auVar61,auVar176);
  auVar54 = vaddps_avx512vl(auVar56,auVar250);
  auVar61 = vaddps_avx512vl(auVar61,auVar176);
  auVar217._0_4_ = auVar57._0_4_ + auVar44._0_4_ * 0.33333334;
  auVar217._4_4_ = auVar57._4_4_ + auVar44._4_4_ * 0.33333334;
  auVar217._8_4_ = auVar57._8_4_ + auVar44._8_4_ * 0.33333334;
  auVar217._12_4_ = auVar57._12_4_ + auVar44._12_4_ * 0.33333334;
  auVar207._0_4_ = auVar45._0_4_ * 0.33333334;
  auVar207._4_4_ = auVar45._4_4_ * 0.33333334;
  auVar207._8_4_ = auVar45._8_4_ * 0.33333334;
  auVar207._12_4_ = auVar45._12_4_ * 0.33333334;
  auVar44 = vsubps_avx(auVar60,auVar207);
  auVar158._0_4_ = auVar46._0_4_ + (fVar234 + auVar157._0_4_) * 0.33333334;
  auVar158._4_4_ = auVar46._4_4_ + (fVar235 + auVar157._4_4_) * 0.33333334;
  auVar158._8_4_ = auVar46._8_4_ + (fVar142 + auVar157._8_4_) * 0.33333334;
  auVar158._12_4_ = auVar46._12_4_ + (fVar151 + auVar157._12_4_) * 0.33333334;
  auVar177._0_4_ = auVar61._0_4_ * 0.33333334;
  auVar177._4_4_ = auVar61._4_4_ * 0.33333334;
  auVar177._8_4_ = auVar61._8_4_ * 0.33333334;
  auVar177._12_4_ = auVar61._12_4_ * 0.33333334;
  auVar45 = vsubps_avx(auVar54,auVar177);
  auVar259._4_4_ = fVar239;
  auVar259._0_4_ = fVar239;
  auVar259._8_4_ = fVar239;
  auVar259._12_4_ = fVar239;
  auVar61 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar239));
  auVar115._0_4_ = auVar61._0_4_;
  auVar115._4_4_ = auVar115._0_4_;
  auVar115._8_4_ = auVar115._0_4_;
  auVar115._12_4_ = auVar115._0_4_;
  auVar57 = vmulps_avx512vl(auVar259,auVar57);
  auVar61 = vmulps_avx512vl(auVar259,auVar217);
  auVar44 = vmulps_avx512vl(auVar259,auVar44);
  auVar265._0_4_ = fVar239 * auVar60._0_4_;
  auVar265._4_4_ = fVar239 * auVar60._4_4_;
  auVar265._8_4_ = fVar239 * auVar60._8_4_;
  auVar265._12_4_ = fVar239 * auVar60._12_4_;
  local_218 = vfmadd231ps_avx512vl(auVar57,auVar115,auVar51);
  local_228 = vfmadd231ps_avx512vl(auVar61,auVar115,auVar189);
  local_238 = vfmadd231ps_avx512vl(auVar44,auVar115,auVar58);
  local_248 = vfmadd231ps_fma(auVar265,auVar115,auVar47);
  auVar44 = vmulps_avx512vl(auVar259,auVar46);
  auVar46 = vmulps_avx512vl(auVar259,auVar158);
  auVar45 = vmulps_avx512vl(auVar259,auVar45);
  auVar251._0_4_ = fVar239 * auVar54._0_4_;
  auVar251._4_4_ = fVar239 * auVar54._4_4_;
  auVar251._8_4_ = fVar239 * auVar54._8_4_;
  auVar251._12_4_ = fVar239 * auVar54._12_4_;
  _local_258 = vfmadd231ps_avx512vl(auVar44,auVar115,auVar49);
  _local_268 = vfmadd231ps_avx512vl(auVar46,auVar115,_local_438);
  _local_278 = vfmadd231ps_avx512vl(auVar45,auVar115,auVar59);
  _local_288 = vfmadd231ps_fma(auVar251,auVar115,auVar52);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar112 = *(float *)(ray + k * 4 + 0x30);
  local_198 = vsubps_avx512vl(local_218,auVar44);
  uVar113 = local_198._0_4_;
  auVar123._4_4_ = uVar113;
  auVar123._0_4_ = uVar113;
  auVar123._8_4_ = uVar113;
  auVar123._12_4_ = uVar113;
  auVar45 = vshufps_avx(local_198,local_198,0x55);
  auVar46 = vshufps_avx(local_198,local_198,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar121 = pre->ray_space[k].vz.field_0.m128[0];
  fVar239 = pre->ray_space[k].vz.field_0.m128[1];
  fVar225 = pre->ray_space[k].vz.field_0.m128[2];
  fVar234 = pre->ray_space[k].vz.field_0.m128[3];
  auVar116._0_4_ = fVar121 * auVar46._0_4_;
  auVar116._4_4_ = fVar239 * auVar46._4_4_;
  auVar116._8_4_ = fVar225 * auVar46._8_4_;
  auVar116._12_4_ = fVar234 * auVar46._12_4_;
  auVar45 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar4,auVar45);
  auVar57 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar123);
  local_1a8 = vsubps_avx512vl(local_228,auVar44);
  uVar113 = local_1a8._0_4_;
  auVar128._4_4_ = uVar113;
  auVar128._0_4_ = uVar113;
  auVar128._8_4_ = uVar113;
  auVar128._12_4_ = uVar113;
  auVar45 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar46 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar124._0_4_ = fVar121 * auVar46._0_4_;
  auVar124._4_4_ = fVar239 * auVar46._4_4_;
  auVar124._8_4_ = fVar225 * auVar46._8_4_;
  auVar124._12_4_ = fVar234 * auVar46._12_4_;
  auVar45 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar4,auVar45);
  auVar58 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar128);
  local_1b8 = vsubps_avx512vl(local_238,auVar44);
  uVar113 = local_1b8._0_4_;
  auVar178._4_4_ = uVar113;
  auVar178._0_4_ = uVar113;
  auVar178._8_4_ = uVar113;
  auVar178._12_4_ = uVar113;
  auVar45 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar46 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar129._0_4_ = fVar121 * auVar46._0_4_;
  auVar129._4_4_ = fVar239 * auVar46._4_4_;
  auVar129._8_4_ = fVar225 * auVar46._8_4_;
  auVar129._12_4_ = fVar234 * auVar46._12_4_;
  auVar45 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar4,auVar45);
  auVar59 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar178);
  local_1c8 = vsubps_avx(local_248,auVar44);
  uVar113 = local_1c8._0_4_;
  auVar199._4_4_ = uVar113;
  auVar199._0_4_ = uVar113;
  auVar199._8_4_ = uVar113;
  auVar199._12_4_ = uVar113;
  auVar45 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar46 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar179._0_4_ = fVar121 * auVar46._0_4_;
  auVar179._4_4_ = fVar239 * auVar46._4_4_;
  auVar179._8_4_ = fVar225 * auVar46._8_4_;
  auVar179._12_4_ = fVar234 * auVar46._12_4_;
  auVar45 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar4,auVar45);
  auVar61 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar199);
  local_1d8 = vsubps_avx512vl(_local_258,auVar44);
  uVar113 = local_1d8._0_4_;
  auVar200._4_4_ = uVar113;
  auVar200._0_4_ = uVar113;
  auVar200._8_4_ = uVar113;
  auVar200._12_4_ = uVar113;
  auVar45 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar46 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar218._0_4_ = auVar46._0_4_ * fVar121;
  auVar218._4_4_ = auVar46._4_4_ * fVar239;
  auVar218._8_4_ = auVar46._8_4_ * fVar225;
  auVar218._12_4_ = auVar46._12_4_ * fVar234;
  auVar45 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar4,auVar45);
  auVar62 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar200);
  local_1e8 = vsubps_avx512vl(_local_268,auVar44);
  uVar113 = local_1e8._0_4_;
  auVar201._4_4_ = uVar113;
  auVar201._0_4_ = uVar113;
  auVar201._8_4_ = uVar113;
  auVar201._12_4_ = uVar113;
  auVar45 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar46 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar226._0_4_ = auVar46._0_4_ * fVar121;
  auVar226._4_4_ = auVar46._4_4_ * fVar239;
  auVar226._8_4_ = auVar46._8_4_ * fVar225;
  auVar226._12_4_ = auVar46._12_4_ * fVar234;
  auVar45 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar4,auVar45);
  auVar63 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar201);
  local_1f8 = vsubps_avx512vl(_local_278,auVar44);
  uVar113 = local_1f8._0_4_;
  auVar202._4_4_ = uVar113;
  auVar202._0_4_ = uVar113;
  auVar202._8_4_ = uVar113;
  auVar202._12_4_ = uVar113;
  auVar45 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar46 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar241._0_4_ = auVar46._0_4_ * fVar121;
  auVar241._4_4_ = auVar46._4_4_ * fVar239;
  auVar241._8_4_ = auVar46._8_4_ * fVar225;
  auVar241._12_4_ = auVar46._12_4_ * fVar234;
  auVar45 = vfmadd231ps_fma(auVar241,(undefined1  [16])aVar4,auVar45);
  auVar14 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar202);
  local_208 = vsubps_avx(_local_288,auVar44);
  uVar113 = local_208._0_4_;
  auVar144._4_4_ = uVar113;
  auVar144._0_4_ = uVar113;
  auVar144._8_4_ = uVar113;
  auVar144._12_4_ = uVar113;
  auVar44 = vshufps_avx(local_208,local_208,0x55);
  auVar45 = vshufps_avx(local_208,local_208,0xaa);
  auVar190._0_4_ = auVar45._0_4_ * fVar121;
  auVar190._4_4_ = auVar45._4_4_ * fVar239;
  auVar190._8_4_ = auVar45._8_4_ * fVar225;
  auVar190._12_4_ = auVar45._12_4_ * fVar234;
  auVar44 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar4,auVar44);
  auVar15 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar144);
  auVar46 = vmovlhps_avx(auVar57,auVar62);
  auVar54 = vmovlhps_avx(auVar58,auVar63);
  local_328 = vmovlhps_avx(auVar59,auVar14);
  _local_158 = vmovlhps_avx512f(auVar61,auVar15);
  auVar45 = vminps_avx(auVar46,auVar54);
  auVar44 = vmaxps_avx(auVar46,auVar54);
  auVar60 = vminps_avx512vl(local_328,_local_158);
  auVar45 = vminps_avx(auVar45,auVar60);
  auVar60 = vmaxps_avx512vl(local_328,_local_158);
  auVar44 = vmaxps_avx(auVar44,auVar60);
  auVar60 = vshufpd_avx(auVar45,auVar45,3);
  auVar45 = vminps_avx(auVar45,auVar60);
  auVar60 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vmaxps_avx(auVar44,auVar60);
  auVar45 = vandps_avx512vl(auVar45,auVar275._0_16_);
  auVar44 = vandps_avx512vl(auVar44,auVar275._0_16_);
  auVar44 = vmaxps_avx(auVar45,auVar44);
  auVar45 = vmovshdup_avx(auVar44);
  auVar44 = vmaxss_avx(auVar45,auVar44);
  fVar121 = auVar44._0_4_ * 9.536743e-07;
  auVar45 = vmovddup_avx512vl(auVar57);
  auVar60 = vmovddup_avx512vl(auVar58);
  auVar57 = vmovddup_avx512vl(auVar59);
  auVar58 = vmovddup_avx512vl(auVar61);
  auVar125._4_4_ = fVar121;
  auVar125._0_4_ = fVar121;
  auVar125._8_4_ = fVar121;
  auVar125._12_4_ = fVar121;
  local_148._16_4_ = fVar121;
  local_148._0_16_ = auVar125;
  local_148._20_4_ = fVar121;
  local_148._24_4_ = fVar121;
  local_148._28_4_ = fVar121;
  auVar44 = vxorps_avx512vl(auVar125,auVar64);
  local_78 = auVar44._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  uVar31 = 0;
  local_168 = vsubps_avx(auVar54,auVar46);
  local_178 = vsubps_avx(local_328,auVar54);
  local_188 = vsubps_avx512vl(_local_158,local_328);
  local_298 = vsubps_avx512vl(_local_258,local_218);
  local_2a8 = vsubps_avx512vl(_local_268,local_228);
  local_2b8 = vsubps_avx512vl(_local_278,local_238);
  _local_2c8 = vsubps_avx(_local_288,local_248);
  local_2e8 = vpbroadcastd_avx512vl();
  local_2f8 = vpbroadcastd_avx512vl();
  auVar44 = ZEXT816(0x3f80000000000000);
  auVar126 = auVar44;
LAB_01bc4b50:
  do {
    auVar59 = vshufps_avx(auVar126,auVar126,0x50);
    auVar260._8_4_ = 0x3f800000;
    auVar260._0_8_ = 0x3f8000003f800000;
    auVar260._12_4_ = 0x3f800000;
    auVar263._16_4_ = 0x3f800000;
    auVar263._0_16_ = auVar260;
    auVar263._20_4_ = 0x3f800000;
    auVar263._24_4_ = 0x3f800000;
    auVar263._28_4_ = 0x3f800000;
    auVar61 = vsubps_avx(auVar260,auVar59);
    fVar239 = auVar59._0_4_;
    fVar142 = auVar62._0_4_;
    auVar145._0_4_ = fVar142 * fVar239;
    fVar225 = auVar59._4_4_;
    fVar151 = auVar62._4_4_;
    auVar145._4_4_ = fVar151 * fVar225;
    fVar234 = auVar59._8_4_;
    auVar145._8_4_ = fVar142 * fVar234;
    fVar235 = auVar59._12_4_;
    auVar145._12_4_ = fVar151 * fVar235;
    fVar152 = auVar63._0_4_;
    auVar159._0_4_ = fVar152 * fVar239;
    fVar168 = auVar63._4_4_;
    auVar159._4_4_ = fVar168 * fVar225;
    auVar159._8_4_ = fVar152 * fVar234;
    auVar159._12_4_ = fVar168 * fVar235;
    fVar169 = auVar14._0_4_;
    auVar180._0_4_ = fVar169 * fVar239;
    fVar186 = auVar14._4_4_;
    auVar180._4_4_ = fVar186 * fVar225;
    auVar180._8_4_ = fVar169 * fVar234;
    auVar180._12_4_ = fVar186 * fVar235;
    fVar187 = auVar15._0_4_;
    auVar130._0_4_ = fVar187 * fVar239;
    fVar195 = auVar15._4_4_;
    auVar130._4_4_ = fVar195 * fVar225;
    auVar130._8_4_ = fVar187 * fVar234;
    auVar130._12_4_ = fVar195 * fVar235;
    auVar64 = vfmadd231ps_avx512vl(auVar145,auVar61,auVar45);
    auVar65 = vfmadd231ps_avx512vl(auVar159,auVar61,auVar60);
    auVar47 = vfmadd231ps_avx512vl(auVar180,auVar61,auVar57);
    auVar61 = vfmadd231ps_avx512vl(auVar130,auVar58,auVar61);
    auVar59 = vmovshdup_avx(auVar44);
    fVar225 = auVar44._0_4_;
    fVar239 = (auVar59._0_4_ - fVar225) * 0.04761905;
    auVar149._4_4_ = fVar225;
    auVar149._0_4_ = fVar225;
    auVar149._8_4_ = fVar225;
    auVar149._12_4_ = fVar225;
    auVar149._16_4_ = fVar225;
    auVar149._20_4_ = fVar225;
    auVar149._24_4_ = fVar225;
    auVar149._28_4_ = fVar225;
    auVar83._0_8_ = auVar59._0_8_;
    auVar83._8_8_ = auVar83._0_8_;
    auVar83._16_8_ = auVar83._0_8_;
    auVar83._24_8_ = auVar83._0_8_;
    auVar91 = vsubps_avx(auVar83,auVar149);
    uVar113 = auVar64._0_4_;
    auVar93._4_4_ = uVar113;
    auVar93._0_4_ = uVar113;
    auVar93._8_4_ = uVar113;
    auVar93._12_4_ = uVar113;
    auVar93._16_4_ = uVar113;
    auVar93._20_4_ = uVar113;
    auVar93._24_4_ = uVar113;
    auVar93._28_4_ = uVar113;
    auVar86._8_4_ = 1;
    auVar86._0_8_ = 0x100000001;
    auVar86._12_4_ = 1;
    auVar86._16_4_ = 1;
    auVar86._20_4_ = 1;
    auVar86._24_4_ = 1;
    auVar86._28_4_ = 1;
    auVar90 = ZEXT1632(auVar64);
    auVar88 = vpermps_avx2(auVar86,auVar90);
    auVar73 = vbroadcastss_avx512vl(auVar65);
    auVar89 = ZEXT1632(auVar65);
    auVar74 = vpermps_avx512vl(auVar86,auVar89);
    auVar75 = vbroadcastss_avx512vl(auVar47);
    auVar84 = ZEXT1632(auVar47);
    auVar76 = vpermps_avx512vl(auVar86,auVar84);
    auVar77 = vbroadcastss_avx512vl(auVar61);
    auVar87 = ZEXT1632(auVar61);
    auVar78 = vpermps_avx512vl(auVar86,auVar87);
    auVar223._4_4_ = fVar239;
    auVar223._0_4_ = fVar239;
    auVar223._8_4_ = fVar239;
    auVar223._12_4_ = fVar239;
    auVar223._16_4_ = fVar239;
    auVar223._20_4_ = fVar239;
    auVar223._24_4_ = fVar239;
    auVar223._28_4_ = fVar239;
    auVar85._8_4_ = 2;
    auVar85._0_8_ = 0x200000002;
    auVar85._12_4_ = 2;
    auVar85._16_4_ = 2;
    auVar85._20_4_ = 2;
    auVar85._24_4_ = 2;
    auVar85._28_4_ = 2;
    auVar79 = vpermps_avx512vl(auVar85,auVar90);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar81 = vpermps_avx512vl(auVar80,auVar90);
    auVar82 = vpermps_avx512vl(auVar85,auVar89);
    auVar83 = vpermps_avx512vl(auVar80,auVar89);
    auVar90 = vpermps_avx2(auVar85,auVar84);
    auVar84 = vpermps_avx512vl(auVar80,auVar84);
    auVar85 = vpermps_avx512vl(auVar85,auVar87);
    auVar86 = vpermps_avx512vl(auVar80,auVar87);
    auVar59 = vfmadd132ps_fma(auVar91,auVar149,_DAT_01faff20);
    auVar91 = vsubps_avx(auVar263,ZEXT1632(auVar59));
    auVar80 = vmulps_avx512vl(auVar73,ZEXT1632(auVar59));
    auVar89 = ZEXT1632(auVar59);
    auVar87 = vmulps_avx512vl(auVar74,auVar89);
    auVar61 = vfmadd231ps_fma(auVar80,auVar91,auVar93);
    auVar64 = vfmadd231ps_fma(auVar87,auVar91,auVar88);
    auVar80 = vmulps_avx512vl(auVar75,auVar89);
    auVar87 = vmulps_avx512vl(auVar76,auVar89);
    auVar73 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar73);
    auVar74 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar74);
    auVar80 = vmulps_avx512vl(auVar77,auVar89);
    auVar93 = ZEXT1632(auVar59);
    auVar78 = vmulps_avx512vl(auVar78,auVar93);
    auVar75 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar75);
    auVar76 = vfmadd231ps_avx512vl(auVar78,auVar91,auVar76);
    fVar234 = auVar59._0_4_;
    fVar235 = auVar59._4_4_;
    auVar78._4_4_ = fVar235 * auVar73._4_4_;
    auVar78._0_4_ = fVar234 * auVar73._0_4_;
    fVar236 = auVar59._8_4_;
    auVar78._8_4_ = fVar236 * auVar73._8_4_;
    fVar237 = auVar59._12_4_;
    auVar78._12_4_ = fVar237 * auVar73._12_4_;
    auVar78._16_4_ = auVar73._16_4_ * 0.0;
    auVar78._20_4_ = auVar73._20_4_ * 0.0;
    auVar78._24_4_ = auVar73._24_4_ * 0.0;
    auVar78._28_4_ = fVar225;
    auVar80._4_4_ = fVar235 * auVar74._4_4_;
    auVar80._0_4_ = fVar234 * auVar74._0_4_;
    auVar80._8_4_ = fVar236 * auVar74._8_4_;
    auVar80._12_4_ = fVar237 * auVar74._12_4_;
    auVar80._16_4_ = auVar74._16_4_ * 0.0;
    auVar80._20_4_ = auVar74._20_4_ * 0.0;
    auVar80._24_4_ = auVar74._24_4_ * 0.0;
    auVar80._28_4_ = auVar88._28_4_;
    auVar61 = vfmadd231ps_fma(auVar78,auVar91,ZEXT1632(auVar61));
    auVar64 = vfmadd231ps_fma(auVar80,auVar91,ZEXT1632(auVar64));
    auVar92._0_4_ = fVar234 * auVar75._0_4_;
    auVar92._4_4_ = fVar235 * auVar75._4_4_;
    auVar92._8_4_ = fVar236 * auVar75._8_4_;
    auVar92._12_4_ = fVar237 * auVar75._12_4_;
    auVar92._16_4_ = auVar75._16_4_ * 0.0;
    auVar92._20_4_ = auVar75._20_4_ * 0.0;
    auVar92._24_4_ = auVar75._24_4_ * 0.0;
    auVar92._28_4_ = 0;
    auVar87._4_4_ = fVar235 * auVar76._4_4_;
    auVar87._0_4_ = fVar234 * auVar76._0_4_;
    auVar87._8_4_ = fVar236 * auVar76._8_4_;
    auVar87._12_4_ = fVar237 * auVar76._12_4_;
    auVar87._16_4_ = auVar76._16_4_ * 0.0;
    auVar87._20_4_ = auVar76._20_4_ * 0.0;
    auVar87._24_4_ = auVar76._24_4_ * 0.0;
    auVar87._28_4_ = auVar75._28_4_;
    auVar65 = vfmadd231ps_fma(auVar92,auVar91,auVar73);
    auVar47 = vfmadd231ps_fma(auVar87,auVar91,auVar74);
    auVar89._28_4_ = auVar74._28_4_;
    auVar89._0_28_ =
         ZEXT1628(CONCAT412(fVar237 * auVar47._12_4_,
                            CONCAT48(fVar236 * auVar47._8_4_,
                                     CONCAT44(fVar235 * auVar47._4_4_,fVar234 * auVar47._0_4_))));
    auVar48 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar237 * auVar65._12_4_,
                                                 CONCAT48(fVar236 * auVar65._8_4_,
                                                          CONCAT44(fVar235 * auVar65._4_4_,
                                                                   fVar234 * auVar65._0_4_)))),
                              auVar91,ZEXT1632(auVar61));
    auVar49 = vfmadd231ps_fma(auVar89,auVar91,ZEXT1632(auVar64));
    auVar88 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar61));
    auVar73 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar64));
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar88 = vmulps_avx512vl(auVar88,auVar74);
    auVar73 = vmulps_avx512vl(auVar73,auVar74);
    auVar165._0_4_ = fVar239 * auVar88._0_4_;
    auVar165._4_4_ = fVar239 * auVar88._4_4_;
    auVar165._8_4_ = fVar239 * auVar88._8_4_;
    auVar165._12_4_ = fVar239 * auVar88._12_4_;
    auVar165._16_4_ = fVar239 * auVar88._16_4_;
    auVar165._20_4_ = fVar239 * auVar88._20_4_;
    auVar165._24_4_ = fVar239 * auVar88._24_4_;
    auVar165._28_4_ = 0;
    auVar88 = vmulps_avx512vl(auVar223,auVar73);
    auVar64 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
    auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar48),_DAT_01feed00,ZEXT1632(auVar64));
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar49),_DAT_01feed00,ZEXT1632(auVar64));
    auVar133._0_4_ = auVar165._0_4_ + auVar48._0_4_;
    auVar133._4_4_ = auVar165._4_4_ + auVar48._4_4_;
    auVar133._8_4_ = auVar165._8_4_ + auVar48._8_4_;
    auVar133._12_4_ = auVar165._12_4_ + auVar48._12_4_;
    auVar133._16_4_ = auVar165._16_4_ + 0.0;
    auVar133._20_4_ = auVar165._20_4_ + 0.0;
    auVar133._24_4_ = auVar165._24_4_ + 0.0;
    auVar133._28_4_ = 0;
    auVar92 = ZEXT1632(auVar64);
    auVar76 = vpermt2ps_avx512vl(auVar165,_DAT_01feed00,auVar92);
    auVar77 = vaddps_avx512vl(ZEXT1632(auVar49),auVar88);
    auVar78 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,auVar92);
    auVar88 = vsubps_avx(auVar73,auVar76);
    auVar76 = vsubps_avx512vl(auVar75,auVar78);
    auVar78 = vmulps_avx512vl(auVar82,auVar93);
    auVar80 = vmulps_avx512vl(auVar83,auVar93);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar91,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar81);
    auVar87 = vmulps_avx512vl(auVar90,auVar93);
    auVar89 = vmulps_avx512vl(auVar84,auVar93);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar82);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar83);
    auVar79 = vmulps_avx512vl(auVar85,auVar93);
    auVar81 = vmulps_avx512vl(auVar86,auVar93);
    auVar61 = vfmadd231ps_fma(auVar79,auVar91,auVar90);
    auVar90 = vfmadd231ps_avx512vl(auVar81,auVar91,auVar84);
    auVar79 = vmulps_avx512vl(auVar93,auVar87);
    auVar82 = ZEXT1632(auVar59);
    auVar81 = vmulps_avx512vl(auVar82,auVar89);
    auVar78 = vfmadd231ps_avx512vl(auVar79,auVar91,auVar78);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar91,auVar80);
    auVar90 = vmulps_avx512vl(auVar82,auVar90);
    auVar87 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar237 * auVar61._12_4_,
                                            CONCAT48(fVar236 * auVar61._8_4_,
                                                     CONCAT44(fVar235 * auVar61._4_4_,
                                                              fVar234 * auVar61._0_4_)))),auVar91,
                         auVar87);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar89);
    auVar79._4_4_ = fVar235 * auVar87._4_4_;
    auVar79._0_4_ = fVar234 * auVar87._0_4_;
    auVar79._8_4_ = fVar236 * auVar87._8_4_;
    auVar79._12_4_ = fVar237 * auVar87._12_4_;
    auVar79._16_4_ = auVar87._16_4_ * 0.0;
    auVar79._20_4_ = auVar87._20_4_ * 0.0;
    auVar79._24_4_ = auVar87._24_4_ * 0.0;
    auVar79._28_4_ = auVar84._28_4_;
    auVar89 = vmulps_avx512vl(auVar82,auVar90);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar91,auVar78);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar80,auVar91);
    auVar91 = vsubps_avx512vl(auVar87,auVar78);
    auVar90 = vsubps_avx512vl(auVar90,auVar80);
    auVar91 = vmulps_avx512vl(auVar91,auVar74);
    auVar90 = vmulps_avx512vl(auVar90,auVar74);
    fVar225 = fVar239 * auVar91._0_4_;
    fVar234 = fVar239 * auVar91._4_4_;
    auVar81._4_4_ = fVar234;
    auVar81._0_4_ = fVar225;
    fVar235 = fVar239 * auVar91._8_4_;
    auVar81._8_4_ = fVar235;
    fVar236 = fVar239 * auVar91._12_4_;
    auVar81._12_4_ = fVar236;
    fVar237 = fVar239 * auVar91._16_4_;
    auVar81._16_4_ = fVar237;
    fVar238 = fVar239 * auVar91._20_4_;
    auVar81._20_4_ = fVar238;
    fVar239 = fVar239 * auVar91._24_4_;
    auVar81._24_4_ = fVar239;
    auVar81._28_4_ = auVar91._28_4_;
    auVar90 = vmulps_avx512vl(auVar223,auVar90);
    auVar74 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar92);
    auVar78 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,auVar92);
    auVar224._0_4_ = auVar79._0_4_ + fVar225;
    auVar224._4_4_ = auVar79._4_4_ + fVar234;
    auVar224._8_4_ = auVar79._8_4_ + fVar235;
    auVar224._12_4_ = auVar79._12_4_ + fVar236;
    auVar224._16_4_ = auVar79._16_4_ + fVar237;
    auVar224._20_4_ = auVar79._20_4_ + fVar238;
    auVar224._24_4_ = auVar79._24_4_ + fVar239;
    auVar224._28_4_ = auVar79._28_4_ + auVar91._28_4_;
    auVar91 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,ZEXT1632(auVar64));
    auVar80 = vaddps_avx512vl(auVar89,auVar90);
    auVar90 = vpermt2ps_avx512vl(auVar90,_DAT_01feed00,ZEXT1632(auVar64));
    auVar91 = vsubps_avx(auVar74,auVar91);
    auVar90 = vsubps_avx512vl(auVar78,auVar90);
    auVar149 = ZEXT1632(auVar48);
    auVar87 = vsubps_avx512vl(auVar79,auVar149);
    auVar165 = ZEXT1632(auVar49);
    auVar81 = vsubps_avx512vl(auVar89,auVar165);
    auVar82 = vsubps_avx512vl(auVar74,auVar73);
    auVar87 = vaddps_avx512vl(auVar87,auVar82);
    auVar82 = vsubps_avx512vl(auVar78,auVar75);
    auVar81 = vaddps_avx512vl(auVar81,auVar82);
    auVar82 = vmulps_avx512vl(auVar165,auVar87);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar149,auVar81);
    auVar83 = vmulps_avx512vl(auVar77,auVar87);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar133,auVar81);
    auVar84 = vmulps_avx512vl(auVar76,auVar87);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar88,auVar81);
    auVar85 = vmulps_avx512vl(auVar75,auVar87);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar73,auVar81);
    auVar86 = vmulps_avx512vl(auVar89,auVar87);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar79,auVar81);
    auVar92 = vmulps_avx512vl(auVar80,auVar87);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar224,auVar81);
    auVar93 = vmulps_avx512vl(auVar90,auVar87);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar91,auVar81);
    auVar87 = vmulps_avx512vl(auVar78,auVar87);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar74,auVar81);
    auVar81 = vminps_avx512vl(auVar82,auVar83);
    auVar82 = vmaxps_avx512vl(auVar82,auVar83);
    auVar83 = vminps_avx512vl(auVar84,auVar85);
    auVar81 = vminps_avx512vl(auVar81,auVar83);
    auVar83 = vmaxps_avx512vl(auVar84,auVar85);
    auVar82 = vmaxps_avx512vl(auVar82,auVar83);
    auVar83 = vminps_avx512vl(auVar86,auVar92);
    auVar84 = vmaxps_avx512vl(auVar86,auVar92);
    auVar85 = vminps_avx512vl(auVar93,auVar87);
    auVar83 = vminps_avx512vl(auVar83,auVar85);
    auVar81 = vminps_avx512vl(auVar81,auVar83);
    auVar87 = vmaxps_avx512vl(auVar93,auVar87);
    auVar87 = vmaxps_avx512vl(auVar84,auVar87);
    auVar87 = vmaxps_avx512vl(auVar82,auVar87);
    uVar12 = vcmpps_avx512vl(auVar81,local_148,2);
    auVar82._4_4_ = uStack_74;
    auVar82._0_4_ = local_78;
    auVar82._8_4_ = uStack_70;
    auVar82._12_4_ = uStack_6c;
    auVar82._16_4_ = uStack_68;
    auVar82._20_4_ = uStack_64;
    auVar82._24_4_ = uStack_60;
    auVar82._28_4_ = uStack_5c;
    uVar13 = vcmpps_avx512vl(auVar87,auVar82,5);
    bVar28 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar28 == 0) {
      auVar44 = vxorps_avx512vl(auVar87._0_16_,auVar87._0_16_);
      auVar271 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar278 = ZEXT1664(auVar44);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar272 = ZEXT3264(auVar91);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar273 = ZEXT1664(auVar44);
      in_ZMM22 = ZEXT464(0x3a83126f);
      auVar274 = ZEXT3264(_DAT_01feed20);
      auVar84 = _DAT_01feed20;
    }
    else {
      auVar87 = vsubps_avx512vl(auVar73,auVar149);
      auVar81 = vsubps_avx512vl(auVar75,auVar165);
      auVar83 = vsubps_avx512vl(auVar74,auVar79);
      auVar87 = vaddps_avx512vl(auVar87,auVar83);
      auVar83 = vsubps_avx512vl(auVar78,auVar89);
      auVar81 = vaddps_avx512vl(auVar81,auVar83);
      auVar83 = vmulps_avx512vl(auVar165,auVar87);
      auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar81,auVar149);
      auVar77 = vmulps_avx512vl(auVar77,auVar87);
      auVar77 = vfnmadd213ps_avx512vl(auVar133,auVar81,auVar77);
      auVar76 = vmulps_avx512vl(auVar76,auVar87);
      auVar76 = vfnmadd213ps_avx512vl(auVar88,auVar81,auVar76);
      auVar88 = vmulps_avx512vl(auVar75,auVar87);
      auVar75 = vfnmadd231ps_avx512vl(auVar88,auVar81,auVar73);
      auVar88 = vmulps_avx512vl(auVar89,auVar87);
      auVar89 = vfnmadd231ps_avx512vl(auVar88,auVar81,auVar79);
      auVar88 = vmulps_avx512vl(auVar80,auVar87);
      auVar80 = vfnmadd213ps_avx512vl(auVar224,auVar81,auVar88);
      auVar88 = vmulps_avx512vl(auVar90,auVar87);
      auVar79 = vfnmadd213ps_avx512vl(auVar91,auVar81,auVar88);
      auVar91 = vmulps_avx512vl(auVar78,auVar87);
      auVar78 = vfnmadd231ps_avx512vl(auVar91,auVar74,auVar81);
      auVar88 = vminps_avx(auVar83,auVar77);
      auVar91 = vmaxps_avx(auVar83,auVar77);
      auVar73 = vminps_avx(auVar76,auVar75);
      auVar73 = vminps_avx(auVar88,auVar73);
      auVar88 = vmaxps_avx(auVar76,auVar75);
      auVar91 = vmaxps_avx(auVar91,auVar88);
      auVar90 = vminps_avx(auVar89,auVar80);
      auVar88 = vmaxps_avx(auVar89,auVar80);
      auVar74 = vminps_avx(auVar79,auVar78);
      auVar90 = vminps_avx(auVar90,auVar74);
      auVar90 = vminps_avx(auVar73,auVar90);
      auVar73 = vmaxps_avx(auVar79,auVar78);
      auVar88 = vmaxps_avx(auVar88,auVar73);
      auVar91 = vmaxps_avx(auVar91,auVar88);
      uVar12 = vcmpps_avx512vl(auVar91,auVar82,5);
      uVar13 = vcmpps_avx512vl(auVar90,local_148,2);
      bVar28 = bVar28 & (byte)uVar12 & (byte)uVar13;
      in_ZMM22 = ZEXT464(0x3a83126f);
      auVar274 = ZEXT3264(_DAT_01feed20);
      if (bVar28 != 0) {
        auStack_318[uVar31] = (uint)bVar28;
        uVar12 = vmovlps_avx(auVar44);
        (&uStack_128)[uVar31] = uVar12;
        uVar43 = vmovlps_avx(auVar126);
        auStack_58[uVar31] = uVar43;
        uVar31 = (ulong)((int)uVar31 + 1);
      }
      auVar44 = vxorps_avx512vl(auVar87._0_16_,auVar87._0_16_);
      auVar271 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar278 = ZEXT1664(auVar44);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar272 = ZEXT3264(auVar91);
      auVar84._16_16_ = auVar91._16_16_;
      auVar84._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar273 = ZEXT1664(auVar84._0_16_);
    }
LAB_01bc50a6:
    do {
      do {
        do {
          auVar61 = auVar276._0_16_;
          auVar59 = auVar271._0_16_;
          auVar68 = auVar84._16_16_;
          if ((int)uVar31 == 0) {
            uVar113 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar21._4_4_ = uVar113;
            auVar21._0_4_ = uVar113;
            auVar21._8_4_ = uVar113;
            auVar21._12_4_ = uVar113;
            uVar12 = vcmpps_avx512vl(local_2d8,auVar21,2);
            uVar37 = (uint)uVar42 & (uint)uVar42 + 0xf & (uint)uVar12;
            uVar42 = (ulong)uVar37;
            if (uVar37 == 0) {
              return;
            }
            goto LAB_01bc3ffd;
          }
          uVar29 = (int)uVar31 - 1;
          uVar32 = (ulong)uVar29;
          uVar110 = auStack_318[uVar32];
          auVar126._8_8_ = 0;
          auVar126._0_8_ = auStack_58[uVar32];
          uVar43 = 0;
          for (uVar36 = (ulong)uVar110; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000
              ) {
            uVar43 = uVar43 + 1;
          }
          uVar34 = uVar110 - 1 & uVar110;
          bVar40 = uVar34 == 0;
          auStack_318[uVar32] = uVar34;
          if (bVar40) {
            uVar31 = (ulong)uVar29;
          }
          auVar117._8_8_ = 0;
          auVar117._0_8_ = uVar43;
          auVar44 = vpunpcklqdq_avx(auVar117,ZEXT416((int)uVar43 + 1));
          auVar44 = vcvtqq2ps_avx512vl(auVar44);
          auVar44 = vmulps_avx512vl(auVar44,auVar273._0_16_);
          uVar113 = *(undefined4 *)((long)&uStack_128 + uVar32 * 8 + 4);
          auVar16._4_4_ = uVar113;
          auVar16._0_4_ = uVar113;
          auVar16._8_4_ = uVar113;
          auVar16._12_4_ = uVar113;
          auVar64 = vmulps_avx512vl(auVar44,auVar16);
          auVar44 = vsubps_avx512vl(auVar61,auVar44);
          uVar113 = *(undefined4 *)(&uStack_128 + uVar32);
          auVar17._4_4_ = uVar113;
          auVar17._0_4_ = uVar113;
          auVar17._8_4_ = uVar113;
          auVar17._12_4_ = uVar113;
          auVar44 = vfmadd231ps_avx512vl(auVar64,auVar44,auVar17);
          auVar64 = vmovshdup_avx(auVar44);
          fVar239 = auVar64._0_4_ - auVar44._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar239));
          if (uVar110 == 0 || bVar40) goto LAB_01bc4b50;
          auVar64 = vshufps_avx(auVar126,auVar126,0x50);
          auVar65 = vucomiss_avx512f(ZEXT416((uint)fVar239));
          in_ZMM22 = ZEXT1664(auVar65);
          auVar48 = vsubps_avx512vl(auVar61,auVar64);
          fVar225 = auVar64._0_4_;
          auVar160._0_4_ = fVar225 * fVar142;
          fVar234 = auVar64._4_4_;
          auVar160._4_4_ = fVar234 * fVar151;
          fVar235 = auVar64._8_4_;
          auVar160._8_4_ = fVar235 * fVar142;
          fVar236 = auVar64._12_4_;
          auVar160._12_4_ = fVar236 * fVar151;
          auVar181._0_4_ = fVar225 * fVar152;
          auVar181._4_4_ = fVar234 * fVar168;
          auVar181._8_4_ = fVar235 * fVar152;
          auVar181._12_4_ = fVar236 * fVar168;
          auVar191._0_4_ = fVar225 * fVar169;
          auVar191._4_4_ = fVar234 * fVar186;
          auVar191._8_4_ = fVar235 * fVar169;
          auVar191._12_4_ = fVar236 * fVar186;
          auVar135._0_4_ = fVar225 * fVar187;
          auVar135._4_4_ = fVar234 * fVar195;
          auVar135._8_4_ = fVar235 * fVar187;
          auVar135._12_4_ = fVar236 * fVar195;
          auVar64 = vfmadd231ps_fma(auVar160,auVar48,auVar45);
          auVar65 = vfmadd231ps_fma(auVar181,auVar48,auVar60);
          auVar47 = vfmadd231ps_fma(auVar191,auVar48,auVar57);
          auVar49 = vfmadd231ps_avx512vl(auVar135,auVar58,auVar48);
          auVar150._16_16_ = auVar64;
          auVar150._0_16_ = auVar64;
          auVar166._16_16_ = auVar65;
          auVar166._0_16_ = auVar65;
          auVar185._16_16_ = auVar47;
          auVar185._0_16_ = auVar47;
          auVar88 = vpermps_avx512vl(auVar274._0_32_,ZEXT1632(auVar44));
          auVar91 = vsubps_avx(auVar166,auVar150);
          auVar65 = vfmadd213ps_fma(auVar91,auVar88,auVar150);
          auVar91 = vsubps_avx(auVar185,auVar166);
          auVar48 = vfmadd213ps_fma(auVar91,auVar88,auVar166);
          auVar64 = vsubps_avx(auVar49,auVar47);
          auVar167._16_16_ = auVar64;
          auVar167._0_16_ = auVar64;
          auVar64 = vfmadd213ps_fma(auVar167,auVar88,auVar185);
          auVar91 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar65));
          auVar65 = vfmadd213ps_fma(auVar91,auVar88,ZEXT1632(auVar65));
          auVar91 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar48));
          auVar64 = vfmadd213ps_fma(auVar91,auVar88,ZEXT1632(auVar48));
          auVar91 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar65));
          auVar56 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar91,auVar88);
          auVar91 = vmulps_avx512vl(auVar91,auVar272._0_32_);
          auVar84._16_16_ = auVar91._16_16_;
          auVar64 = vmulss_avx512f(ZEXT416((uint)fVar239),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar225 = auVar64._0_4_;
          auVar192._0_8_ =
               CONCAT44(auVar56._4_4_ + fVar225 * auVar91._4_4_,
                        auVar56._0_4_ + fVar225 * auVar91._0_4_);
          auVar192._8_4_ = auVar56._8_4_ + fVar225 * auVar91._8_4_;
          auVar192._12_4_ = auVar56._12_4_ + fVar225 * auVar91._12_4_;
          auVar161._0_4_ = fVar225 * auVar91._16_4_;
          auVar161._4_4_ = fVar225 * auVar91._20_4_;
          auVar161._8_4_ = fVar225 * auVar91._24_4_;
          auVar161._12_4_ = fVar225 * auVar91._28_4_;
          auVar68 = vsubps_avx((undefined1  [16])0x0,auVar161);
          auVar49 = vshufpd_avx(auVar56,auVar56,3);
          auVar50 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar64 = vsubps_avx(auVar49,auVar56);
          auVar65 = vsubps_avx(auVar50,(undefined1  [16])0x0);
          auVar208._0_4_ = auVar64._0_4_ + auVar65._0_4_;
          auVar208._4_4_ = auVar64._4_4_ + auVar65._4_4_;
          auVar208._8_4_ = auVar64._8_4_ + auVar65._8_4_;
          auVar208._12_4_ = auVar64._12_4_ + auVar65._12_4_;
          auVar64 = vshufps_avx(auVar56,auVar56,0xb1);
          auVar65 = vshufps_avx(auVar192,auVar192,0xb1);
          auVar47 = vshufps_avx(auVar68,auVar68,0xb1);
          auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar261._4_4_ = auVar208._0_4_;
          auVar261._0_4_ = auVar208._0_4_;
          auVar261._8_4_ = auVar208._0_4_;
          auVar261._12_4_ = auVar208._0_4_;
          auVar51 = vshufps_avx(auVar208,auVar208,0x55);
          fVar225 = auVar51._0_4_;
          auVar219._0_4_ = auVar64._0_4_ * fVar225;
          fVar234 = auVar51._4_4_;
          auVar219._4_4_ = auVar64._4_4_ * fVar234;
          fVar235 = auVar51._8_4_;
          auVar219._8_4_ = auVar64._8_4_ * fVar235;
          fVar236 = auVar51._12_4_;
          auVar219._12_4_ = auVar64._12_4_ * fVar236;
          auVar227._0_4_ = auVar65._0_4_ * fVar225;
          auVar227._4_4_ = auVar65._4_4_ * fVar234;
          auVar227._8_4_ = auVar65._8_4_ * fVar235;
          auVar227._12_4_ = auVar65._12_4_ * fVar236;
          auVar242._0_4_ = auVar47._0_4_ * fVar225;
          auVar242._4_4_ = auVar47._4_4_ * fVar234;
          auVar242._8_4_ = auVar47._8_4_ * fVar235;
          auVar242._12_4_ = auVar47._12_4_ * fVar236;
          auVar209._0_4_ = auVar48._0_4_ * fVar225;
          auVar209._4_4_ = auVar48._4_4_ * fVar234;
          auVar209._8_4_ = auVar48._8_4_ * fVar235;
          auVar209._12_4_ = auVar48._12_4_ * fVar236;
          auVar64 = vfmadd231ps_fma(auVar219,auVar261,auVar56);
          auVar65 = vfmadd231ps_fma(auVar227,auVar261,auVar192);
          auVar53 = vfmadd231ps_fma(auVar242,auVar261,auVar68);
          auVar55 = vfmadd231ps_fma(auVar209,(undefined1  [16])0x0,auVar261);
          auVar51 = vshufpd_avx(auVar64,auVar64,1);
          auVar52 = vshufpd_avx(auVar65,auVar65,1);
          auVar66 = vshufpd_avx512vl(auVar53,auVar53,1);
          auVar67 = vshufpd_avx512vl(auVar55,auVar55,1);
          auVar47 = vminss_avx(auVar64,auVar65);
          auVar64 = vmaxss_avx(auVar65,auVar64);
          auVar48 = vminss_avx(auVar53,auVar55);
          auVar65 = vmaxss_avx(auVar55,auVar53);
          auVar47 = vminss_avx(auVar47,auVar48);
          auVar64 = vmaxss_avx(auVar65,auVar64);
          auVar48 = vminss_avx(auVar51,auVar52);
          auVar65 = vmaxss_avx(auVar52,auVar51);
          auVar51 = vminss_avx512f(auVar66,auVar67);
          auVar52 = vmaxss_avx512f(auVar67,auVar66);
          auVar65 = vmaxss_avx(auVar52,auVar65);
          auVar84._0_16_ = vminss_avx512f(auVar48,auVar51);
          vucomiss_avx512f(auVar47);
          fVar234 = auVar65._0_4_;
          fVar225 = auVar64._0_4_;
          if (4 < (uint)uVar31) {
            bVar41 = fVar234 == -0.0001;
            bVar38 = NAN(fVar234);
            if (fVar234 <= -0.0001) goto LAB_01bc52d3;
            break;
          }
LAB_01bc52d3:
          auVar48 = vucomiss_avx512f(auVar84._0_16_);
          bVar41 = fVar234 <= -0.0001;
          bVar39 = -0.0001 < fVar225;
          bVar38 = bVar41;
          if (!bVar41) break;
          uVar12 = vcmpps_avx512vl(auVar47,auVar48,5);
          uVar13 = vcmpps_avx512vl(auVar84._0_16_,auVar48,5);
          bVar28 = (byte)uVar12 & (byte)uVar13 & 1;
          bVar41 = bVar39 && bVar28 == 0;
          bVar38 = bVar39 && bVar28 == 0;
        } while (!bVar39 || bVar28 != 0);
        vcmpss_avx512f(auVar47,auVar59,1);
        auVar52 = auVar277._0_16_;
        uVar12 = vcmpss_avx512f(auVar64,auVar59,1);
        bVar39 = (bool)((byte)uVar12 & 1);
        auVar95._16_16_ = auVar84._16_16_;
        auVar95._0_16_ = auVar52;
        iVar111 = auVar277._0_4_;
        auVar94._4_28_ = auVar95._4_28_;
        auVar94._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar111);
        vucomiss_avx512f(auVar94._0_16_);
        bVar38 = (bool)(!bVar41 | bVar38);
        bVar39 = bVar38 == false;
        auVar97._16_16_ = auVar84._16_16_;
        auVar97._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar96._4_28_ = auVar97._4_28_;
        auVar96._0_4_ = (uint)bVar38 * auVar271._0_4_ + (uint)!bVar38 * 0x7f800000;
        auVar51 = auVar96._0_16_;
        auVar99._16_16_ = auVar84._16_16_;
        auVar99._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar38 * auVar271._0_4_ + (uint)!bVar38 * -0x800000;
        auVar48 = auVar98._0_16_;
        uVar12 = vcmpss_avx512f(auVar84._0_16_,auVar59,1);
        bVar41 = (bool)((byte)uVar12 & 1);
        auVar101._16_16_ = auVar84._16_16_;
        auVar101._0_16_ = auVar52;
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * iVar111);
        vucomiss_avx512f(auVar100._0_16_);
        if ((bVar38) || (bVar39)) {
          auVar53 = vucomiss_avx512f(auVar47);
          if ((bVar38) || (bVar39)) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar55 = vxorps_avx512vl(auVar47,auVar20);
            auVar47 = vsubss_avx512f(auVar53,auVar47);
            auVar47 = vdivss_avx512f(auVar55,auVar47);
            auVar53 = vsubss_avx512f(auVar52,auVar47);
            auVar47 = vfmadd213ss_avx512f(auVar53,auVar59,auVar47);
            auVar53 = auVar47;
          }
          else {
            auVar53 = vxorps_avx512vl(auVar53,auVar53);
            vucomiss_avx512f(auVar53);
            if ((bVar38) || (auVar47 = auVar52, bVar39)) {
              auVar47 = SUB6416(ZEXT464(0xff800000),0);
              auVar53 = ZEXT416(0x7f800000);
            }
          }
          auVar51 = vminss_avx512f(auVar51,auVar53);
          auVar48 = vmaxss_avx(auVar47,auVar48);
        }
        uVar12 = vcmpss_avx512f(auVar65,auVar59,1);
        bVar41 = (bool)((byte)uVar12 & 1);
        fVar235 = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * iVar111);
        if ((auVar94._0_4_ != fVar235) || (NAN(auVar94._0_4_) || NAN(fVar235))) {
          if ((fVar234 != fVar225) || (NAN(fVar234) || NAN(fVar225))) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar64 = vxorps_avx512vl(auVar64,auVar19);
            auVar210._0_4_ = auVar64._0_4_ / (fVar234 - fVar225);
            auVar210._4_12_ = auVar64._4_12_;
            auVar64 = vsubss_avx512f(auVar52,auVar210);
            auVar64 = vfmadd213ss_avx512f(auVar64,auVar59,auVar210);
            auVar65 = auVar64;
          }
          else if ((fVar225 != 0.0) ||
                  (auVar64 = auVar52, auVar65 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar225))) {
            auVar64 = SUB6416(ZEXT464(0xff800000),0);
            auVar65 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar51 = vminss_avx(auVar51,auVar65);
          auVar48 = vmaxss_avx(auVar64,auVar48);
        }
        bVar41 = auVar100._0_4_ != fVar235;
        auVar64 = vminss_avx512f(auVar51,auVar52);
        auVar103._16_16_ = auVar84._16_16_;
        auVar103._0_16_ = auVar51;
        auVar102._4_28_ = auVar103._4_28_;
        auVar102._0_4_ = (uint)bVar41 * auVar64._0_4_ + (uint)!bVar41 * auVar51._0_4_;
        auVar64 = vmaxss_avx512f(auVar52,auVar48);
        auVar105._16_16_ = auVar84._16_16_;
        auVar105._0_16_ = auVar48;
        auVar104._4_28_ = auVar105._4_28_;
        auVar104._0_4_ = (uint)bVar41 * auVar64._0_4_ + (uint)!bVar41 * auVar48._0_4_;
        auVar64 = vmaxss_avx512f(auVar59,auVar102._0_16_);
        auVar84._0_16_ = vminss_avx512f(auVar104._0_16_,auVar52);
      } while (auVar84._0_4_ < auVar64._0_4_);
      auVar48 = vmaxss_avx512f(auVar59,ZEXT416((uint)(auVar64._0_4_ + -0.1)));
      auVar53 = vminss_avx512f(ZEXT416((uint)(auVar84._0_4_ + 0.1)),auVar52);
      auVar136._0_8_ = auVar56._0_8_;
      auVar136._8_8_ = auVar136._0_8_;
      auVar228._8_8_ = auVar192._0_8_;
      auVar228._0_8_ = auVar192._0_8_;
      auVar243._8_8_ = auVar68._0_8_;
      auVar243._0_8_ = auVar68._0_8_;
      auVar64 = vshufpd_avx(auVar192,auVar192,3);
      auVar65 = vshufpd_avx(auVar68,auVar68,3);
      auVar47 = vshufps_avx(auVar48,auVar53,0);
      auVar68 = vsubps_avx512vl(auVar61,auVar47);
      fVar225 = auVar47._0_4_;
      auVar182._0_4_ = fVar225 * auVar49._0_4_;
      fVar234 = auVar47._4_4_;
      auVar182._4_4_ = fVar234 * auVar49._4_4_;
      fVar235 = auVar47._8_4_;
      auVar182._8_4_ = fVar235 * auVar49._8_4_;
      fVar236 = auVar47._12_4_;
      auVar182._12_4_ = fVar236 * auVar49._12_4_;
      auVar193._0_4_ = fVar225 * auVar64._0_4_;
      auVar193._4_4_ = fVar234 * auVar64._4_4_;
      auVar193._8_4_ = fVar235 * auVar64._8_4_;
      auVar193._12_4_ = fVar236 * auVar64._12_4_;
      auVar266._0_4_ = auVar65._0_4_ * fVar225;
      auVar266._4_4_ = auVar65._4_4_ * fVar234;
      auVar266._8_4_ = auVar65._8_4_ * fVar235;
      auVar266._12_4_ = auVar65._12_4_ * fVar236;
      auVar162._0_4_ = fVar225 * auVar50._0_4_;
      auVar162._4_4_ = fVar234 * auVar50._4_4_;
      auVar162._8_4_ = fVar235 * auVar50._8_4_;
      auVar162._12_4_ = fVar236 * auVar50._12_4_;
      auVar49 = vfmadd231ps_fma(auVar182,auVar68,auVar136);
      auVar50 = vfmadd231ps_fma(auVar193,auVar68,auVar228);
      auVar51 = vfmadd231ps_fma(auVar266,auVar68,auVar243);
      auVar68 = vfmadd231ps_fma(auVar162,auVar68,ZEXT816(0));
      auVar65 = vsubss_avx512f(auVar52,auVar48);
      auVar64 = vmovshdup_avx(auVar126);
      auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar48._0_4_)),auVar126,auVar65);
      auVar65 = vsubss_avx512f(auVar52,auVar53);
      auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar53._0_4_)),auVar126,auVar65);
      auVar53 = vdivss_avx512f(auVar52,ZEXT416((uint)fVar239));
      auVar64 = vsubps_avx(auVar50,auVar49);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar47 = vmulps_avx512vl(auVar64,auVar55);
      auVar64 = vsubps_avx(auVar51,auVar50);
      auVar48 = vmulps_avx512vl(auVar64,auVar55);
      auVar64 = vsubps_avx(auVar68,auVar51);
      auVar64 = vmulps_avx512vl(auVar64,auVar55);
      auVar65 = vminps_avx(auVar48,auVar64);
      auVar64 = vmaxps_avx(auVar48,auVar64);
      auVar65 = vminps_avx(auVar47,auVar65);
      auVar64 = vmaxps_avx(auVar47,auVar64);
      auVar47 = vshufpd_avx(auVar65,auVar65,3);
      auVar48 = vshufpd_avx(auVar64,auVar64,3);
      auVar65 = vminps_avx(auVar65,auVar47);
      auVar64 = vmaxps_avx(auVar64,auVar48);
      fVar239 = auVar53._0_4_;
      auVar211._0_4_ = auVar65._0_4_ * fVar239;
      auVar211._4_4_ = auVar65._4_4_ * fVar239;
      auVar211._8_4_ = auVar65._8_4_ * fVar239;
      auVar211._12_4_ = auVar65._12_4_ * fVar239;
      auVar203._0_4_ = fVar239 * auVar64._0_4_;
      auVar203._4_4_ = fVar239 * auVar64._4_4_;
      auVar203._8_4_ = fVar239 * auVar64._8_4_;
      auVar203._12_4_ = fVar239 * auVar64._12_4_;
      auVar53 = vdivss_avx512f(auVar52,ZEXT416((uint)(auVar67._0_4_ - auVar66._0_4_)));
      auVar64 = vshufpd_avx(auVar49,auVar49,3);
      auVar65 = vshufpd_avx(auVar50,auVar50,3);
      auVar47 = vshufpd_avx(auVar51,auVar51,3);
      auVar48 = vshufpd_avx(auVar68,auVar68,3);
      auVar64 = vsubps_avx(auVar64,auVar49);
      auVar49 = vsubps_avx(auVar65,auVar50);
      auVar50 = vsubps_avx(auVar47,auVar51);
      auVar48 = vsubps_avx(auVar48,auVar68);
      auVar65 = vminps_avx(auVar64,auVar49);
      auVar64 = vmaxps_avx(auVar64,auVar49);
      auVar47 = vminps_avx(auVar50,auVar48);
      auVar47 = vminps_avx(auVar65,auVar47);
      auVar65 = vmaxps_avx(auVar50,auVar48);
      auVar64 = vmaxps_avx(auVar64,auVar65);
      fVar239 = auVar53._0_4_;
      auVar244._0_4_ = fVar239 * auVar47._0_4_;
      auVar244._4_4_ = fVar239 * auVar47._4_4_;
      auVar244._8_4_ = fVar239 * auVar47._8_4_;
      auVar244._12_4_ = fVar239 * auVar47._12_4_;
      auVar229._0_4_ = fVar239 * auVar64._0_4_;
      auVar229._4_4_ = fVar239 * auVar64._4_4_;
      auVar229._8_4_ = fVar239 * auVar64._8_4_;
      auVar229._12_4_ = fVar239 * auVar64._12_4_;
      auVar48 = vinsertps_avx(auVar44,auVar66,0x10);
      auVar69 = vpermt2ps_avx512vl(auVar44,_DAT_01feecd0,auVar67);
      auVar127._0_4_ = auVar48._0_4_ + auVar69._0_4_;
      auVar127._4_4_ = auVar48._4_4_ + auVar69._4_4_;
      auVar127._8_4_ = auVar48._8_4_ + auVar69._8_4_;
      auVar127._12_4_ = auVar48._12_4_ + auVar69._12_4_;
      auVar53 = vmulps_avx512vl(auVar127,auVar278._0_16_);
      auVar65 = vshufps_avx(auVar53,auVar53,0x54);
      uVar113 = auVar53._0_4_;
      auVar131._4_4_ = uVar113;
      auVar131._0_4_ = uVar113;
      auVar131._8_4_ = uVar113;
      auVar131._12_4_ = uVar113;
      auVar50 = vfmadd213ps_avx512vl(local_168,auVar131,auVar46);
      auVar47 = vfmadd213ps_fma(local_178,auVar131,auVar54);
      auVar49 = vfmadd213ps_fma(local_188,auVar131,local_328);
      auVar64 = vsubps_avx(auVar47,auVar50);
      auVar50 = vfmadd213ps_fma(auVar64,auVar131,auVar50);
      auVar64 = vsubps_avx(auVar49,auVar47);
      auVar64 = vfmadd213ps_fma(auVar64,auVar131,auVar47);
      auVar64 = vsubps_avx(auVar64,auVar50);
      auVar47 = vfmadd231ps_fma(auVar50,auVar64,auVar131);
      auVar51 = vmulps_avx512vl(auVar64,auVar55);
      auVar252._8_8_ = auVar47._0_8_;
      auVar252._0_8_ = auVar47._0_8_;
      auVar64 = vshufpd_avx(auVar47,auVar47,3);
      auVar47 = vshufps_avx(auVar53,auVar53,0x55);
      auVar49 = vsubps_avx(auVar64,auVar252);
      auVar50 = vfmadd231ps_fma(auVar252,auVar47,auVar49);
      auVar267._8_8_ = auVar51._0_8_;
      auVar267._0_8_ = auVar51._0_8_;
      auVar64 = vshufpd_avx(auVar51,auVar51,3);
      auVar64 = vsubps_avx512vl(auVar64,auVar267);
      auVar64 = vfmadd213ps_avx512vl(auVar64,auVar47,auVar267);
      auVar132._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
      auVar132._8_4_ = auVar49._8_4_ ^ 0x80000000;
      auVar132._12_4_ = auVar49._12_4_ ^ 0x80000000;
      auVar47 = vmovshdup_avx512vl(auVar64);
      auVar268._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
      auVar268._8_4_ = auVar47._8_4_ ^ 0x80000000;
      auVar268._12_4_ = auVar47._12_4_ ^ 0x80000000;
      auVar51 = vmovshdup_avx512vl(auVar49);
      auVar68 = vpermt2ps_avx512vl(auVar268,ZEXT416(5),auVar49);
      auVar47 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar47._0_4_ * auVar49._0_4_)),auVar64,auVar51);
      auVar49 = vpermt2ps_avx512vl(auVar64,SUB6416(ZEXT464(4),0),auVar132);
      auVar163._0_4_ = auVar47._0_4_;
      auVar163._4_4_ = auVar163._0_4_;
      auVar163._8_4_ = auVar163._0_4_;
      auVar163._12_4_ = auVar163._0_4_;
      auVar64 = vdivps_avx(auVar68,auVar163);
      auVar70 = vdivps_avx512vl(auVar49,auVar163);
      fVar239 = auVar50._0_4_;
      auVar47 = vshufps_avx(auVar50,auVar50,0x55);
      auVar253._0_4_ = fVar239 * auVar64._0_4_ + auVar47._0_4_ * auVar70._0_4_;
      auVar253._4_4_ = fVar239 * auVar64._4_4_ + auVar47._4_4_ * auVar70._4_4_;
      auVar253._8_4_ = fVar239 * auVar64._8_4_ + auVar47._8_4_ * auVar70._8_4_;
      auVar253._12_4_ = fVar239 * auVar64._12_4_ + auVar47._12_4_ * auVar70._12_4_;
      auVar55 = vsubps_avx(auVar65,auVar253);
      auVar47 = vmovshdup_avx(auVar64);
      auVar65 = vinsertps_avx(auVar211,auVar244,0x1c);
      auVar269._0_4_ = auVar47._0_4_ * auVar65._0_4_;
      auVar269._4_4_ = auVar47._4_4_ * auVar65._4_4_;
      auVar269._8_4_ = auVar47._8_4_ * auVar65._8_4_;
      auVar269._12_4_ = auVar47._12_4_ * auVar65._12_4_;
      auVar56 = vinsertps_avx512f(auVar203,auVar229,0x1c);
      auVar47 = vmulps_avx512vl(auVar47,auVar56);
      auVar68 = vminps_avx512vl(auVar269,auVar47);
      auVar50 = vmaxps_avx(auVar47,auVar269);
      auVar51 = vmovshdup_avx(auVar70);
      auVar47 = vinsertps_avx(auVar244,auVar211,0x4c);
      auVar245._0_4_ = auVar51._0_4_ * auVar47._0_4_;
      auVar245._4_4_ = auVar51._4_4_ * auVar47._4_4_;
      auVar245._8_4_ = auVar51._8_4_ * auVar47._8_4_;
      auVar245._12_4_ = auVar51._12_4_ * auVar47._12_4_;
      auVar49 = vinsertps_avx(auVar229,auVar203,0x4c);
      auVar230._0_4_ = auVar51._0_4_ * auVar49._0_4_;
      auVar230._4_4_ = auVar51._4_4_ * auVar49._4_4_;
      auVar230._8_4_ = auVar51._8_4_ * auVar49._8_4_;
      auVar230._12_4_ = auVar51._12_4_ * auVar49._12_4_;
      auVar51 = vminps_avx(auVar245,auVar230);
      auVar68 = vaddps_avx512vl(auVar68,auVar51);
      auVar51 = vmaxps_avx(auVar230,auVar245);
      auVar231._0_4_ = auVar50._0_4_ + auVar51._0_4_;
      auVar231._4_4_ = auVar50._4_4_ + auVar51._4_4_;
      auVar231._8_4_ = auVar50._8_4_ + auVar51._8_4_;
      auVar231._12_4_ = auVar50._12_4_ + auVar51._12_4_;
      auVar246._8_8_ = 0x3f80000000000000;
      auVar246._0_8_ = 0x3f80000000000000;
      auVar50 = vsubps_avx(auVar246,auVar231);
      auVar51 = vsubps_avx(auVar246,auVar68);
      auVar68 = vsubps_avx(auVar48,auVar53);
      auVar53 = vsubps_avx(auVar69,auVar53);
      fVar236 = auVar68._0_4_;
      auVar270._0_4_ = fVar236 * auVar50._0_4_;
      fVar237 = auVar68._4_4_;
      auVar270._4_4_ = fVar237 * auVar50._4_4_;
      fVar238 = auVar68._8_4_;
      auVar270._8_4_ = fVar238 * auVar50._8_4_;
      fVar134 = auVar68._12_4_;
      auVar270._12_4_ = fVar134 * auVar50._12_4_;
      auVar71 = vbroadcastss_avx512vl(auVar64);
      auVar65 = vmulps_avx512vl(auVar71,auVar65);
      auVar56 = vmulps_avx512vl(auVar71,auVar56);
      auVar71 = vminps_avx512vl(auVar65,auVar56);
      auVar56 = vmaxps_avx512vl(auVar56,auVar65);
      auVar65 = vbroadcastss_avx512vl(auVar70);
      auVar47 = vmulps_avx512vl(auVar65,auVar47);
      auVar65 = vmulps_avx512vl(auVar65,auVar49);
      auVar49 = vminps_avx512vl(auVar47,auVar65);
      auVar49 = vaddps_avx512vl(auVar71,auVar49);
      auVar68 = vmulps_avx512vl(auVar68,auVar51);
      fVar239 = auVar53._0_4_;
      auVar232._0_4_ = fVar239 * auVar50._0_4_;
      fVar225 = auVar53._4_4_;
      auVar232._4_4_ = fVar225 * auVar50._4_4_;
      fVar234 = auVar53._8_4_;
      auVar232._8_4_ = fVar234 * auVar50._8_4_;
      fVar235 = auVar53._12_4_;
      auVar232._12_4_ = fVar235 * auVar50._12_4_;
      auVar247._0_4_ = fVar239 * auVar51._0_4_;
      auVar247._4_4_ = fVar225 * auVar51._4_4_;
      auVar247._8_4_ = fVar234 * auVar51._8_4_;
      auVar247._12_4_ = fVar235 * auVar51._12_4_;
      auVar65 = vmaxps_avx(auVar65,auVar47);
      auVar204._0_4_ = auVar56._0_4_ + auVar65._0_4_;
      auVar204._4_4_ = auVar56._4_4_ + auVar65._4_4_;
      auVar204._8_4_ = auVar56._8_4_ + auVar65._8_4_;
      auVar204._12_4_ = auVar56._12_4_ + auVar65._12_4_;
      auVar212._8_8_ = 0x3f800000;
      auVar212._0_8_ = 0x3f800000;
      auVar65 = vsubps_avx(auVar212,auVar204);
      auVar47 = vsubps_avx512vl(auVar212,auVar49);
      auVar262._0_4_ = fVar236 * auVar65._0_4_;
      auVar262._4_4_ = fVar237 * auVar65._4_4_;
      auVar262._8_4_ = fVar238 * auVar65._8_4_;
      auVar262._12_4_ = fVar134 * auVar65._12_4_;
      auVar254._0_4_ = fVar236 * auVar47._0_4_;
      auVar254._4_4_ = fVar237 * auVar47._4_4_;
      auVar254._8_4_ = fVar238 * auVar47._8_4_;
      auVar254._12_4_ = fVar134 * auVar47._12_4_;
      auVar205._0_4_ = fVar239 * auVar65._0_4_;
      auVar205._4_4_ = fVar225 * auVar65._4_4_;
      auVar205._8_4_ = fVar234 * auVar65._8_4_;
      auVar205._12_4_ = fVar235 * auVar65._12_4_;
      auVar213._0_4_ = fVar239 * auVar47._0_4_;
      auVar213._4_4_ = fVar225 * auVar47._4_4_;
      auVar213._8_4_ = fVar234 * auVar47._8_4_;
      auVar213._12_4_ = fVar235 * auVar47._12_4_;
      auVar65 = vminps_avx(auVar262,auVar254);
      auVar47 = vminps_avx512vl(auVar205,auVar213);
      auVar49 = vminps_avx512vl(auVar65,auVar47);
      auVar65 = vmaxps_avx(auVar254,auVar262);
      auVar47 = vmaxps_avx(auVar213,auVar205);
      auVar47 = vmaxps_avx(auVar47,auVar65);
      auVar50 = vminps_avx512vl(auVar270,auVar68);
      auVar65 = vminps_avx(auVar232,auVar247);
      auVar65 = vminps_avx(auVar50,auVar65);
      auVar65 = vhaddps_avx(auVar49,auVar65);
      auVar84._0_16_ = vmaxps_avx512vl(auVar68,auVar270);
      auVar49 = vmaxps_avx(auVar247,auVar232);
      auVar49 = vmaxps_avx(auVar49,auVar84._0_16_);
      auVar47 = vhaddps_avx(auVar47,auVar49);
      auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
      auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
      auVar206._0_4_ = auVar65._0_4_ + auVar55._0_4_;
      auVar206._4_4_ = auVar65._4_4_ + auVar55._4_4_;
      auVar206._8_4_ = auVar65._8_4_ + auVar55._8_4_;
      auVar206._12_4_ = auVar65._12_4_ + auVar55._12_4_;
      auVar214._0_4_ = auVar47._0_4_ + auVar55._0_4_;
      auVar214._4_4_ = auVar47._4_4_ + auVar55._4_4_;
      auVar214._8_4_ = auVar47._8_4_ + auVar55._8_4_;
      auVar214._12_4_ = auVar47._12_4_ + auVar55._12_4_;
      auVar65 = vmaxps_avx(auVar48,auVar206);
      auVar47 = vminps_avx(auVar214,auVar69);
      uVar43 = vcmpps_avx512vl(auVar47,auVar65,1);
    } while ((uVar43 & 3) != 0);
    uVar43 = vcmpps_avx512vl(auVar214,auVar69,1);
    uVar12 = vcmpps_avx512vl(auVar44,auVar206,1);
    if (((ushort)uVar12 & (ushort)uVar43 & 1) == 0) {
      bVar28 = 0;
    }
    else {
      auVar65 = vmovshdup_avx(auVar206);
      bVar28 = auVar66._0_4_ < auVar65._0_4_ & (byte)(uVar43 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar31 || uVar110 != 0 && !bVar40) | bVar28) == 1) {
      lVar33 = 200;
      do {
        auVar44 = vsubss_avx512f(auVar52,auVar55);
        fVar234 = auVar44._0_4_;
        fVar239 = fVar234 * fVar234 * fVar234;
        auVar44 = vmulss_avx512f(auVar55,ZEXT416(0x40400000));
        fVar225 = auVar44._0_4_ * fVar234 * fVar234;
        fVar235 = auVar55._0_4_;
        auVar44 = vmulss_avx512f(ZEXT416((uint)(fVar235 * fVar235)),ZEXT416(0x40400000));
        fVar234 = fVar234 * auVar44._0_4_;
        auVar146._4_4_ = fVar239;
        auVar146._0_4_ = fVar239;
        auVar146._8_4_ = fVar239;
        auVar146._12_4_ = fVar239;
        auVar137._4_4_ = fVar225;
        auVar137._0_4_ = fVar225;
        auVar137._8_4_ = fVar225;
        auVar137._12_4_ = fVar225;
        auVar118._4_4_ = fVar234;
        auVar118._0_4_ = fVar234;
        auVar118._8_4_ = fVar234;
        auVar118._12_4_ = fVar234;
        fVar235 = fVar235 * fVar235 * fVar235;
        auVar183._0_4_ = (float)local_158._0_4_ * fVar235;
        auVar183._4_4_ = (float)local_158._4_4_ * fVar235;
        auVar183._8_4_ = fStack_150 * fVar235;
        auVar183._12_4_ = fStack_14c * fVar235;
        auVar44 = vfmadd231ps_fma(auVar183,local_328,auVar118);
        auVar44 = vfmadd231ps_fma(auVar44,auVar54,auVar137);
        auVar44 = vfmadd231ps_fma(auVar44,auVar46,auVar146);
        auVar119._8_8_ = auVar44._0_8_;
        auVar119._0_8_ = auVar44._0_8_;
        auVar44 = vshufpd_avx(auVar44,auVar44,3);
        auVar65 = vshufps_avx(auVar55,auVar55,0x55);
        auVar44 = vsubps_avx(auVar44,auVar119);
        auVar65 = vfmadd213ps_fma(auVar44,auVar65,auVar119);
        fVar239 = auVar65._0_4_;
        auVar44 = vshufps_avx(auVar65,auVar65,0x55);
        auVar120._0_4_ = auVar64._0_4_ * fVar239 + auVar70._0_4_ * auVar44._0_4_;
        auVar120._4_4_ = auVar64._4_4_ * fVar239 + auVar70._4_4_ * auVar44._4_4_;
        auVar120._8_4_ = auVar64._8_4_ * fVar239 + auVar70._8_4_ * auVar44._8_4_;
        auVar120._12_4_ = auVar64._12_4_ * fVar239 + auVar70._12_4_ * auVar44._12_4_;
        auVar55 = vsubps_avx(auVar55,auVar120);
        auVar44 = vandps_avx512vl(auVar65,auVar275._0_16_);
        auVar84._0_16_ = vprolq_avx512vl(auVar44,0x20);
        auVar44 = vmaxss_avx(auVar84._0_16_,auVar44);
        bVar40 = fVar121 < auVar44._0_4_;
        if (auVar44._0_4_ < fVar121) {
          auVar44 = vucomiss_avx512f(auVar59);
          if (bVar40) break;
          auVar64 = vucomiss_avx512f(auVar44);
          auVar277 = ZEXT1664(auVar64);
          if (bVar40) break;
          vmovshdup_avx(auVar44);
          auVar64 = vucomiss_avx512f(auVar59);
          if (bVar40) break;
          auVar65 = vucomiss_avx512f(auVar64);
          auVar277 = ZEXT1664(auVar65);
          if (bVar40) break;
          auVar47 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar53 = vinsertps_avx(auVar47,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
          auVar47 = vdpps_avx(auVar53,local_198,0x7f);
          auVar48 = vdpps_avx(auVar53,local_1a8,0x7f);
          auVar49 = vdpps_avx(auVar53,local_1b8,0x7f);
          auVar50 = vdpps_avx(auVar53,local_1c8,0x7f);
          auVar51 = vdpps_avx(auVar53,local_1d8,0x7f);
          auVar52 = vdpps_avx(auVar53,local_1e8,0x7f);
          auVar68 = vdpps_avx(auVar53,local_1f8,0x7f);
          auVar53 = vdpps_avx(auVar53,local_208,0x7f);
          auVar55 = vsubss_avx512f(auVar65,auVar64);
          fVar235 = auVar64._0_4_;
          auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * auVar51._0_4_)),auVar55,auVar47);
          auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * fVar235)),auVar55,auVar48);
          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar68._0_4_ * fVar235)),auVar55,auVar49);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * auVar53._0_4_)),auVar55,auVar50);
          auVar65 = vsubss_avx512f(auVar65,auVar44);
          auVar215._0_4_ = auVar65._0_4_;
          fVar239 = auVar215._0_4_ * auVar215._0_4_ * auVar215._0_4_;
          auVar65 = vmulss_avx512f(auVar44,ZEXT416(0x40400000));
          fVar225 = auVar65._0_4_ * auVar215._0_4_ * auVar215._0_4_;
          local_d8 = auVar44._0_4_;
          auVar138._0_4_ = local_d8 * local_d8;
          auVar138._4_4_ = auVar44._4_4_ * auVar44._4_4_;
          auVar138._8_4_ = auVar44._8_4_ * auVar44._8_4_;
          auVar138._12_4_ = auVar44._12_4_ * auVar44._12_4_;
          auVar84._0_16_ = vmulss_avx512f(auVar138,ZEXT416(0x40400000));
          fVar234 = auVar215._0_4_ * auVar84._0_4_;
          fVar237 = local_d8 * auVar138._0_4_;
          auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * auVar49._0_4_)),ZEXT416((uint)fVar234),
                                    auVar48);
          auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar225),auVar47);
          auVar64 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar239),auVar64);
          fVar236 = auVar64._0_4_;
          if ((fVar236 < fVar112) || (fVar238 = *(float *)(ray + k * 4 + 0x80), fVar238 < fVar236))
          break;
          local_c8 = vshufps_avx(auVar44,auVar44,0x55);
          auVar65 = vsubps_avx512vl(auVar61,local_c8);
          fVar134 = local_c8._0_4_;
          auVar220._0_4_ = fVar134 * (float)local_258._0_4_;
          fVar139 = local_c8._4_4_;
          auVar220._4_4_ = fVar139 * (float)local_258._4_4_;
          fVar140 = local_c8._8_4_;
          auVar220._8_4_ = fVar140 * fStack_250;
          fVar141 = local_c8._12_4_;
          auVar220._12_4_ = fVar141 * fStack_24c;
          auVar233._0_4_ = fVar134 * (float)local_268._0_4_;
          auVar233._4_4_ = fVar139 * (float)local_268._4_4_;
          auVar233._8_4_ = fVar140 * fStack_260;
          auVar233._12_4_ = fVar141 * fStack_25c;
          auVar248._0_4_ = fVar134 * (float)local_278._0_4_;
          auVar248._4_4_ = fVar139 * (float)local_278._4_4_;
          auVar248._8_4_ = fVar140 * fStack_270;
          auVar248._12_4_ = fVar141 * fStack_26c;
          auVar255._0_4_ = fVar134 * (float)local_288._0_4_;
          auVar255._4_4_ = fVar139 * (float)local_288._4_4_;
          auVar255._8_4_ = fVar140 * fStack_280;
          auVar255._12_4_ = fVar141 * fStack_27c;
          auVar44 = vfmadd231ps_fma(auVar220,auVar65,local_218);
          auVar61 = vfmadd231ps_fma(auVar233,auVar65,local_228);
          auVar64 = vfmadd231ps_fma(auVar248,auVar65,local_238);
          auVar65 = vfmadd231ps_fma(auVar255,auVar65,local_248);
          auVar44 = vsubps_avx(auVar61,auVar44);
          auVar61 = vsubps_avx(auVar64,auVar61);
          auVar64 = vsubps_avx(auVar65,auVar64);
          auVar256._0_4_ = local_d8 * auVar61._0_4_;
          auVar256._4_4_ = local_d8 * auVar61._4_4_;
          auVar256._8_4_ = local_d8 * auVar61._8_4_;
          auVar256._12_4_ = local_d8 * auVar61._12_4_;
          auVar215._4_4_ = auVar215._0_4_;
          auVar215._8_4_ = auVar215._0_4_;
          auVar215._12_4_ = auVar215._0_4_;
          auVar44 = vfmadd231ps_fma(auVar256,auVar215,auVar44);
          auVar221._0_4_ = local_d8 * auVar64._0_4_;
          auVar221._4_4_ = local_d8 * auVar64._4_4_;
          auVar221._8_4_ = local_d8 * auVar64._8_4_;
          auVar221._12_4_ = local_d8 * auVar64._12_4_;
          auVar61 = vfmadd231ps_fma(auVar221,auVar215,auVar61);
          auVar222._0_4_ = local_d8 * auVar61._0_4_;
          auVar222._4_4_ = local_d8 * auVar61._4_4_;
          auVar222._8_4_ = local_d8 * auVar61._8_4_;
          auVar222._12_4_ = local_d8 * auVar61._12_4_;
          auVar44 = vfmadd231ps_fma(auVar222,auVar215,auVar44);
          auVar18._8_4_ = 0x40400000;
          auVar18._0_8_ = 0x4040000040400000;
          auVar18._12_4_ = 0x40400000;
          auVar84._0_16_ = vmulps_avx512vl(auVar44,auVar18);
          pGVar6 = (context->scene->geometries).items[uVar30].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
          auVar194._0_4_ = fVar237 * (float)local_2c8._0_4_;
          auVar194._4_4_ = fVar237 * (float)local_2c8._4_4_;
          auVar194._8_4_ = fVar237 * fStack_2c0;
          auVar194._12_4_ = fVar237 * fStack_2bc;
          auVar184._4_4_ = fVar234;
          auVar184._0_4_ = fVar234;
          auVar184._8_4_ = fVar234;
          auVar184._12_4_ = fVar234;
          auVar44 = vfmadd132ps_fma(auVar184,auVar194,local_2b8);
          auVar164._4_4_ = fVar225;
          auVar164._0_4_ = fVar225;
          auVar164._8_4_ = fVar225;
          auVar164._12_4_ = fVar225;
          auVar44 = vfmadd132ps_fma(auVar164,auVar44,local_2a8);
          auVar147._4_4_ = fVar239;
          auVar147._0_4_ = fVar239;
          auVar147._8_4_ = fVar239;
          auVar147._12_4_ = fVar239;
          auVar64 = vfmadd132ps_fma(auVar147,auVar44,local_298);
          auVar44 = vshufps_avx(auVar64,auVar64,0xc9);
          auVar61 = vshufps_avx(auVar84._0_16_,auVar84._0_16_,0xc9);
          auVar148._0_4_ = auVar64._0_4_ * auVar61._0_4_;
          auVar148._4_4_ = auVar64._4_4_ * auVar61._4_4_;
          auVar148._8_4_ = auVar64._8_4_ * auVar61._8_4_;
          auVar148._12_4_ = auVar64._12_4_ * auVar61._12_4_;
          auVar44 = vfmsub231ps_fma(auVar148,auVar84._0_16_,auVar44);
          local_e8 = auVar44._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar236;
            uVar113 = vextractps_avx(auVar44,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar113;
            uVar113 = vextractps_avx(auVar44,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar113;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
            *(float *)(ray + k * 4 + 0xf0) = local_d8;
            *(float *)(ray + k * 4 + 0x100) = fVar235;
            *(uint *)(ray + k * 4 + 0x110) = uVar37;
            *(int *)(ray + k * 4 + 0x120) = (int)uVar30;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            break;
          }
          auVar61 = vshufps_avx(auVar44,auVar44,0x55);
          local_f8 = vshufps_avx(auVar44,auVar44,0xaa);
          local_108[0] = (RTCHitN)auVar61[0];
          local_108[1] = (RTCHitN)auVar61[1];
          local_108[2] = (RTCHitN)auVar61[2];
          local_108[3] = (RTCHitN)auVar61[3];
          local_108[4] = (RTCHitN)auVar61[4];
          local_108[5] = (RTCHitN)auVar61[5];
          local_108[6] = (RTCHitN)auVar61[6];
          local_108[7] = (RTCHitN)auVar61[7];
          local_108[8] = (RTCHitN)auVar61[8];
          local_108[9] = (RTCHitN)auVar61[9];
          local_108[10] = (RTCHitN)auVar61[10];
          local_108[0xb] = (RTCHitN)auVar61[0xb];
          local_108[0xc] = (RTCHitN)auVar61[0xc];
          local_108[0xd] = (RTCHitN)auVar61[0xd];
          local_108[0xe] = (RTCHitN)auVar61[0xe];
          local_108[0xf] = (RTCHitN)auVar61[0xf];
          uStack_e4 = local_e8;
          uStack_e0 = local_e8;
          uStack_dc = local_e8;
          fStack_d4 = local_d8;
          fStack_d0 = local_d8;
          fStack_cc = local_d8;
          local_b8 = local_2f8._0_8_;
          uStack_b0 = local_2f8._8_8_;
          local_a8 = local_2e8;
          vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
          uStack_94 = context->user->instID[0];
          local_98 = uStack_94;
          uStack_90 = uStack_94;
          uStack_8c = uStack_94;
          uStack_88 = context->user->instPrimID[0];
          uStack_84 = uStack_88;
          uStack_80 = uStack_88;
          uStack_7c = uStack_88;
          *(float *)(ray + k * 4 + 0x80) = fVar236;
          local_378 = local_308;
          local_358.valid = (int *)local_378;
          local_358.geometryUserPtr = pGVar6->userPtr;
          local_358.context = context->user;
          local_358.hit = local_108;
          local_358.N = 4;
          local_358.ray = (RTCRayN *)ray;
          if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_368 = uVar30;
            (*pGVar6->intersectionFilterN)(&local_358);
            auVar274 = ZEXT3264(_DAT_01feed20);
            in_ZMM22 = ZEXT464(0x3a83126f);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
            auVar273 = ZEXT1664(auVar44);
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
            auVar272 = ZEXT3264(auVar91);
            auVar277 = ZEXT464(0x3f800000);
            auVar84._16_16_ = auVar91._16_16_;
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar278 = ZEXT1664(auVar44);
            auVar44 = vxorps_avx512vl(auVar59,auVar59);
            auVar271 = ZEXT1664(auVar44);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar276 = ZEXT1664(auVar44);
            auVar84._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar275 = ZEXT1664(auVar84._0_16_);
            uVar30 = local_368;
          }
          auVar44 = auVar271._0_16_;
          uVar43 = vptestmd_avx512vl(local_378,local_378);
          if ((uVar43 & 0xf) != 0) {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var11)(&local_358);
              auVar274 = ZEXT3264(_DAT_01feed20);
              in_ZMM22 = ZEXT464(0x3a83126f);
              auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
              auVar273 = ZEXT1664(auVar59);
              auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar272 = ZEXT3264(auVar91);
              auVar277 = ZEXT464(0x3f800000);
              auVar84._16_16_ = auVar91._16_16_;
              auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
              auVar278 = ZEXT1664(auVar59);
              auVar44 = vxorps_avx512vl(auVar44,auVar44);
              auVar271 = ZEXT1664(auVar44);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar276 = ZEXT1664(auVar44);
              auVar84._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar275 = ZEXT1664(auVar84._0_16_);
            }
            uVar43 = vptestmd_avx512vl(local_378,local_378);
            uVar43 = uVar43 & 0xf;
            bVar28 = (byte)uVar43;
            if (bVar28 != 0) {
              iVar111 = *(int *)(local_358.hit + 4);
              iVar26 = *(int *)(local_358.hit + 8);
              iVar27 = *(int *)(local_358.hit + 0xc);
              auVar106._16_16_ = auVar84._16_16_;
              bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
              bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
              bVar38 = SUB81(uVar43 >> 3,0);
              *(uint *)(local_358.ray + 0xc0) =
                   (uint)(bVar28 & 1) * *(int *)local_358.hit |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_358.ray + 0xc0);
              *(uint *)(local_358.ray + 0xc4) =
                   (uint)bVar40 * iVar111 | (uint)!bVar40 * *(int *)(local_358.ray + 0xc4);
              *(uint *)(local_358.ray + 200) =
                   (uint)bVar41 * iVar26 | (uint)!bVar41 * *(int *)(local_358.ray + 200);
              *(uint *)(local_358.ray + 0xcc) =
                   (uint)bVar38 * iVar27 | (uint)!bVar38 * *(int *)(local_358.ray + 0xcc);
              iVar111 = *(int *)(local_358.hit + 0x14);
              iVar26 = *(int *)(local_358.hit + 0x18);
              iVar27 = *(int *)(local_358.hit + 0x1c);
              bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
              bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
              bVar38 = SUB81(uVar43 >> 3,0);
              *(uint *)(local_358.ray + 0xd0) =
                   (uint)(bVar28 & 1) * *(int *)(local_358.hit + 0x10) |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_358.ray + 0xd0);
              *(uint *)(local_358.ray + 0xd4) =
                   (uint)bVar40 * iVar111 | (uint)!bVar40 * *(int *)(local_358.ray + 0xd4);
              *(uint *)(local_358.ray + 0xd8) =
                   (uint)bVar41 * iVar26 | (uint)!bVar41 * *(int *)(local_358.ray + 0xd8);
              *(uint *)(local_358.ray + 0xdc) =
                   (uint)bVar38 * iVar27 | (uint)!bVar38 * *(int *)(local_358.ray + 0xdc);
              iVar111 = *(int *)(local_358.hit + 0x24);
              iVar26 = *(int *)(local_358.hit + 0x28);
              iVar27 = *(int *)(local_358.hit + 0x2c);
              bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
              bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
              bVar38 = SUB81(uVar43 >> 3,0);
              *(uint *)(local_358.ray + 0xe0) =
                   (uint)(bVar28 & 1) * *(int *)(local_358.hit + 0x20) |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_358.ray + 0xe0);
              *(uint *)(local_358.ray + 0xe4) =
                   (uint)bVar40 * iVar111 | (uint)!bVar40 * *(int *)(local_358.ray + 0xe4);
              *(uint *)(local_358.ray + 0xe8) =
                   (uint)bVar41 * iVar26 | (uint)!bVar41 * *(int *)(local_358.ray + 0xe8);
              *(uint *)(local_358.ray + 0xec) =
                   (uint)bVar38 * iVar27 | (uint)!bVar38 * *(int *)(local_358.ray + 0xec);
              iVar111 = *(int *)(local_358.hit + 0x34);
              iVar26 = *(int *)(local_358.hit + 0x38);
              iVar27 = *(int *)(local_358.hit + 0x3c);
              bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
              bVar41 = (bool)((byte)(uVar43 >> 2) & 1);
              bVar38 = SUB81(uVar43 >> 3,0);
              *(uint *)(local_358.ray + 0xf0) =
                   (uint)(bVar28 & 1) * *(int *)(local_358.hit + 0x30) |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_358.ray + 0xf0);
              *(uint *)(local_358.ray + 0xf4) =
                   (uint)bVar40 * iVar111 | (uint)!bVar40 * *(int *)(local_358.ray + 0xf4);
              *(uint *)(local_358.ray + 0xf8) =
                   (uint)bVar41 * iVar26 | (uint)!bVar41 * *(int *)(local_358.ray + 0xf8);
              *(uint *)(local_358.ray + 0xfc) =
                   (uint)bVar38 * iVar27 | (uint)!bVar38 * *(int *)(local_358.ray + 0xfc);
              iVar111 = *(int *)(local_358.ray + 0x104);
              iVar26 = *(int *)(local_358.ray + 0x108);
              iVar27 = *(int *)(local_358.ray + 0x10c);
              auVar72._0_4_ =
                   (uint)(bVar28 & 1) * *(int *)(local_358.hit + 0x40) |
                   (uint)!(bool)(bVar28 & 1) * *(int *)(local_358.ray + 0x100);
              bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
              auVar72._4_4_ =
                   (uint)bVar40 * *(int *)(local_358.hit + 0x44) | (uint)!bVar40 * iVar111;
              bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
              auVar72._8_4_ = (uint)bVar40 * *(int *)(local_358.hit + 0x48) | (uint)!bVar40 * iVar26
              ;
              bVar40 = SUB81(uVar43 >> 3,0);
              auVar72._12_4_ =
                   (uint)bVar40 * *(int *)(local_358.hit + 0x4c) | (uint)!bVar40 * iVar27;
              auVar106._0_16_ = auVar72;
              *(undefined1 (*) [16])(local_358.ray + 0x100) = auVar72;
              bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
              uVar110 = bVar40 * auVar72._4_4_ | (uint)!bVar40 * iVar111;
              auVar22._4_24_ = auVar106._8_24_;
              auVar22._0_4_ = uVar110;
              auVar107._0_8_ = auVar22._0_8_ << 0x20;
              bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
              auVar107._8_4_ = bVar40 * auVar72._8_4_ | (uint)!bVar40 * iVar26;
              bVar40 = SUB81(uVar43 >> 3,0);
              auVar107._12_4_ = bVar40 * auVar72._12_4_ | (uint)!bVar40 * iVar27;
              auVar107._16_16_ = auVar106._16_16_;
              auVar44 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x50));
              *(undefined1 (*) [16])(local_358.ray + 0x110) = auVar44;
              bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
              uVar110 = bVar40 * uVar110 | (uint)!bVar40 * iVar111;
              auVar23._4_24_ = auVar107._8_24_;
              auVar23._0_4_ = uVar110;
              auVar108._0_8_ = auVar23._0_8_ << 0x20;
              bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
              auVar108._8_4_ = bVar40 * auVar107._8_4_ | (uint)!bVar40 * iVar26;
              bVar40 = SUB81(uVar43 >> 3,0);
              auVar108._12_4_ = bVar40 * auVar107._12_4_ | (uint)!bVar40 * iVar27;
              auVar108._16_16_ = auVar106._16_16_;
              auVar44 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x60));
              *(undefined1 (*) [16])(local_358.ray + 0x120) = auVar44;
              bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
              uVar110 = bVar40 * uVar110 | (uint)!bVar40 * iVar111;
              auVar24._4_24_ = auVar108._8_24_;
              auVar24._0_4_ = uVar110;
              auVar109._0_8_ = auVar24._0_8_ << 0x20;
              bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
              auVar109._8_4_ = bVar40 * auVar108._8_4_ | (uint)!bVar40 * iVar26;
              bVar40 = SUB81(uVar43 >> 3,0);
              auVar109._12_4_ = bVar40 * auVar108._12_4_ | (uint)!bVar40 * iVar27;
              auVar109._16_16_ = auVar106._16_16_;
              auVar44 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x70));
              *(undefined1 (*) [16])(local_358.ray + 0x130) = auVar44;
              bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
              auVar25._4_24_ = auVar109._8_24_;
              auVar25._0_4_ = bVar40 * uVar110 | (uint)!bVar40 * iVar111;
              auVar84._0_8_ = auVar25._0_8_ << 0x20;
              bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
              auVar84._8_4_ = bVar40 * auVar109._8_4_ | (uint)!bVar40 * iVar26;
              bVar40 = SUB81(uVar43 >> 3,0);
              auVar84._12_4_ = bVar40 * auVar109._12_4_ | (uint)!bVar40 * iVar27;
              auVar84._16_16_ = auVar106._16_16_;
              auVar44 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x80));
              *(undefined1 (*) [16])(local_358.ray + 0x140) = auVar44;
              break;
            }
          }
          *(float *)(ray + k * 4 + 0x80) = fVar238;
          break;
        }
        lVar33 = lVar33 + -1;
      } while (lVar33 != 0);
      goto LAB_01bc50a6;
    }
    auVar126 = vinsertps_avx(auVar66,auVar67,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }